

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void custom_compare_commit_compact(bool eqkeys)

{
  char *__s;
  size_t keylen;
  size_t keylen_00;
  fdb_encryption_key new_key;
  void *ptr;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  hbtrie *phVar6;
  hbtrie *phVar7;
  btree *pbVar8;
  size_t sVar9;
  fdb_doc *pfVar10;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle **ppfVar12;
  fdb_kvs_handle *pfVar13;
  size_t sVar14;
  char cVar15;
  fdb_kvs_handle *pfVar16;
  long lVar17;
  fdb_config *pfVar18;
  fdb_doc *pfVar19;
  char *unaff_RBP;
  char *pcVar20;
  fdb_encryption_key *pfVar21;
  undefined7 in_register_00000039;
  undefined1 *puVar22;
  char *pcVar23;
  fdb_iterator **doc;
  code *handle;
  fdb_file_handle **ptr_fhandle;
  uint uVar24;
  char *pcVar25;
  ulong uVar26;
  fdb_doc **doc_00;
  fdb_iterator **ptr_iterator;
  fdb_doc *pfVar27;
  fdb_doc **ppfVar28;
  fdb_kvs_handle **ptr_handle;
  bool bVar29;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  uint64_t user_param;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [1024];
  fdb_kvs_handle *pfStack_1e5f0;
  fdb_file_handle *pfStack_1e5e8;
  void *pvStack_1e5e0;
  size_t asStack_1e5d8 [3];
  undefined4 uStack_1e5c0;
  undefined4 uStack_1e5bc;
  undefined4 uStack_1e5b8;
  undefined4 uStack_1e5b4;
  undefined4 uStack_1e5b0;
  fdb_kvs_config fStack_1e5a8;
  timeval tStack_1e590;
  fdb_config fStack_1e580;
  char acStack_1e488 [256];
  char acStack_1e388 [256];
  char acStack_1e288 [264];
  fdb_config *pfStack_1e180;
  fdb_iterator **ppfStack_1e178;
  fdb_kvs_handle *pfStack_1e170;
  fdb_iterator **ppfStack_1e168;
  fdb_kvs_handle *pfStack_1e160;
  code *pcStack_1e158;
  fdb_iterator *pfStack_1e140;
  fdb_file_handle *pfStack_1e138;
  fdb_kvs_handle *pfStack_1e130;
  fdb_kvs_handle *pfStack_1e128;
  fdb_kvs_config fStack_1e120;
  timeval tStack_1e108;
  fdb_config fStack_1e0f8;
  fdb_iterator *apfStack_1e000 [32];
  fdb_config fStack_1df00;
  fdb_kvs_handle **ppfStack_1ddf8;
  fdb_iterator **ppfStack_1ddf0;
  fdb_iterator **ppfStack_1dde8;
  fdb_kvs_handle *pfStack_1dde0;
  fdb_iterator *pfStack_1ddd0;
  fdb_kvs_handle *pfStack_1ddc8;
  fdb_iterator **ppfStack_1ddc0;
  fdb_kvs_handle *pfStack_1ddb8;
  fdb_kvs_config fStack_1ddb0;
  fdb_kvs_handle *apfStack_1dd98 [8];
  undefined1 auStack_1dd58 [64];
  fdb_iterator *apfStack_1dd18 [33];
  fdb_config fStack_1dc10;
  fdb_iterator *apfStack_1db18 [32];
  fdb_iterator *apfStack_1da18 [32];
  fdb_kvs_handle fStack_1d918;
  undefined8 auStack_1d518 [896];
  fdb_kvs_handle *apfStack_1b918 [1025];
  fdb_doc **ppfStack_19910;
  char *pcStack_19908;
  long lStack_19900;
  fdb_doc *pfStack_198f8;
  fdb_doc **ppfStack_198f0;
  fdb_doc *pfStack_198e8;
  fdb_doc *pfStack_198d0;
  fdb_file_handle *pfStack_198c8;
  long lStack_198c0;
  fdb_kvs_handle *pfStack_198b8;
  long lStack_198b0;
  long lStack_198a8;
  fdb_doc **ppfStack_198a0;
  long lStack_19898;
  fdb_doc **ppfStack_19890;
  size_t sStack_19888;
  timeval tStack_19880;
  fdb_kvs_config fStack_19870;
  fdb_file_info fStack_19858;
  fdb_doc afStack_19810 [3];
  char acStack_19710 [264];
  fdb_config fStack_19608;
  char acStack_19510 [256];
  fdb_doc *apfStack_19410 [2999];
  size_t sStack_13658;
  size_t asStack_13650 [1023];
  undefined1 auStack_11651 [57225];
  fdb_doc **ppfStack_36c8;
  fdb_config *pfStack_36c0;
  fdb_file_handle **ppfStack_36b8;
  ulong uStack_36b0;
  fdb_kvs_handle **ppfStack_36a8;
  fdb_kvs_handle **ppfStack_36a0;
  fdb_doc *pfStack_3688;
  fdb_kvs_handle *pfStack_3680;
  undefined1 auStack_3678 [24];
  fdb_file_handle *pfStack_3660;
  fdb_kvs_handle *pfStack_3658;
  fdb_kvs_config fStack_3650;
  fdb_doc *apfStack_3638 [31];
  timeval tStack_3540;
  fdb_config fStack_3530;
  char acStack_3438 [256];
  fdb_file_handle *apfStack_3338 [32];
  char acStack_3238 [264];
  fdb_kvs_handle **ppfStack_3130;
  char *pcStack_3128;
  char *pcStack_3120;
  ulong uStack_3118;
  undefined8 uStack_3110;
  code *pcStack_3108;
  fdb_file_handle *pfStack_3100;
  fdb_kvs_handle *pfStack_30f8;
  char acStack_30f0 [32];
  fdb_kvs_config fStack_30d0;
  timeval tStack_30b8;
  fdb_file_info afStack_30a8 [3];
  fdb_config fStack_2fb0;
  fdb_config *pfStack_2eb8;
  fdb_kvs_handle **ppfStack_2eb0;
  fdb_kvs_handle *pfStack_2ea8;
  fdb_doc *pfStack_2ea0;
  fdb_kvs_handle *pfStack_2e98;
  fdb_encryption_key *pfStack_2e90;
  fdb_kvs_handle *pfStack_2e80;
  fdb_file_handle *pfStack_2e78;
  undefined1 auStack_2e70 [8];
  undefined1 auStack_2e68 [48];
  fdb_kvs_handle *apfStack_2e38 [32];
  fdb_doc afStack_2d38 [3];
  fdb_config fStack_2c38;
  ulong uStack_2b40;
  fdb_kvs_handle **ppfStack_2b38;
  fdb_kvs_handle *pfStack_2b30;
  fdb_doc *pfStack_2b28;
  fdb_kvs_handle *pfStack_2b20;
  fdb_encryption_key *pfStack_2b18;
  fdb_doc *pfStack_2b08;
  fdb_kvs_handle *pfStack_2b00;
  fdb_kvs_handle *pfStack_2af8;
  fdb_file_handle *pfStack_2af0;
  fdb_file_handle *pfStack_2ae8;
  fdb_doc *apfStack_2ae0 [11];
  fdb_kvs_config fStack_2a88;
  timeval tStack_2a70;
  fdb_kvs_handle fStack_2a60;
  fdb_config fStack_2760;
  fdb_kvs_config *pfStack_2668;
  fdb_file_handle **ppfStack_2660;
  fdb_file_handle **ppfStack_2658;
  fdb_kvs_handle **ppfStack_2650;
  char *pcStack_2648;
  fdb_doc *pfStack_2640;
  fdb_file_handle *pfStack_2628;
  fdb_kvs_handle *pfStack_2620;
  fdb_kvs_handle *pfStack_2618;
  fdb_file_handle *pfStack_2610;
  fdb_doc *apfStack_2608 [31];
  timeval tStack_2510;
  fdb_kvs_config fStack_2500;
  char acStack_24e8 [264];
  fdb_config fStack_23e0;
  char acStack_22e8 [256];
  char acStack_21e8 [264];
  fdb_kvs_handle *pfStack_20e0;
  fdb_kvs_handle *pfStack_20d8;
  fdb_kvs_handle *pfStack_20d0;
  fdb_kvs_handle *pfStack_20c8;
  fdb_kvs_handle **ppfStack_20c0;
  fdb_doc *pfStack_20b8;
  fdb_kvs_handle *pfStack_20a8;
  fdb_kvs_handle *pfStack_20a0;
  undefined1 auStack_2098 [32];
  undefined1 auStack_2078 [280];
  fdb_doc afStack_1f60 [3];
  fdb_config afStack_1e58 [2];
  fdb_kvs_handle *pfStack_1c58;
  fdb_kvs_handle *pfStack_1c50;
  fdb_kvs_handle *pfStack_1c48;
  fdb_doc *pfStack_1c40;
  fdb_doc **ppfStack_1c38;
  fdb_doc *pfStack_1c30;
  fdb_doc *pfStack_1c20;
  fdb_kvs_handle *pfStack_1c18;
  fdb_doc *pfStack_1c10;
  fdb_doc *apfStack_1c08 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1be0;
  timeval tStack_1bb0;
  fdb_doc afStack_1ba0 [3];
  fdb_doc afStack_1a88 [3];
  char acStack_1988 [256];
  fdb_config fStack_1888;
  fdb_doc *pfStack_1790;
  fdb_kvs_handle *pfStack_1788;
  fdb_kvs_handle *pfStack_1780;
  btree *pbStack_1778;
  fdb_doc *pfStack_1770;
  fdb_doc *pfStack_1768;
  undefined1 auStack_1750 [16];
  undefined1 auStack_1740 [24];
  timeval tStack_1728;
  undefined1 auStack_1718 [280];
  fdb_doc afStack_1600 [5];
  size_t *psStack_1470;
  btree abStack_12e0 [4];
  char acStack_11e0 [256];
  fdb_config fStack_10e0;
  fdb_kvs_handle **ppfStack_fe8;
  fdb_kvs_handle *pfStack_fe0;
  fdb_kvs_handle *pfStack_fd8;
  fdb_kvs_handle *pfStack_fd0;
  btree *pbStack_fc8;
  fdb_doc *pfStack_fc0;
  fdb_kvs_handle *pfStack_fb0;
  undefined1 auStack_fa8 [16];
  undefined1 auStack_f98 [40];
  btree *pbStack_f70;
  undefined1 auStack_f40 [40];
  undefined1 auStack_f18 [256];
  undefined8 uStack_e18;
  uint64_t uStack_e10;
  uint64_t uStack_e08;
  snap_handle *psStack_e00;
  uint uStack_df8;
  undefined4 uStack_df4;
  undefined4 uStack_df0;
  undefined4 uStack_dec;
  undefined4 uStack_de8;
  undefined4 uStack_de4;
  undefined4 uStack_de0;
  undefined4 uStack_ddc;
  atomic<unsigned_char> aStack_dd8;
  char acStack_d18 [264];
  fdb_config fStack_c10;
  char acStack_b18 [264];
  fdb_kvs_handle *pfStack_a10;
  fdb_kvs_handle *pfStack_a08;
  fdb_kvs_handle *pfStack_a00;
  fdb_kvs_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_doc *pfStack_9e8;
  fdb_doc *pfStack_9c8;
  fdb_file_handle *pfStack_9c0;
  int iStack_9b4;
  undefined1 auStack_9b0 [56];
  undefined1 auStack_978 [40];
  undefined1 auStack_950 [80];
  undefined1 auStack_900 [512];
  fdb_doc fStack_700;
  fdb_custom_cmp_variable p_Stack_6a8;
  void *pvStack_6a0;
  undefined1 uStack_690;
  undefined4 uStack_68c;
  undefined1 uStack_681;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_670 [23];
  ulong uStack_5b8;
  fdb_kvs_handle *pfStack_5b0;
  fdb_kvs_handle *pfStack_5a8;
  fdb_kvs_handle *pfStack_5a0;
  fdb_kvs_handle *pfStack_598;
  code *pcStack_590;
  fdb_kvs_handle *local_580;
  fdb_kvs_handle *local_578;
  fdb_doc *local_570;
  fdb_kvs_handle *local_568;
  kvs_ops_stat *local_560;
  undefined1 local_558 [40];
  undefined1 local_530 [249];
  undefined1 local_437 [3];
  undefined1 local_434 [1019];
  undefined1 local_39;
  
  uVar26 = CONCAT71(in_register_00000039,eqkeys) & 0xffffffff;
  handle = (code *)0x0;
  pcStack_590 = (code *)0x115946;
  gettimeofday((timeval *)(local_558 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_590 = (code *)0x11594b;
  memleak_start();
  local_570 = (fdb_doc *)0x0;
  pcVar25 = local_530;
  pcStack_590 = (code *)0x11595d;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)local_558;
  pcStack_590 = (code *)0x11596a;
  fdb_get_default_kvs_config();
  pcVar23 = "rm -rf  dummy* > errorlog.txt";
  pcStack_590 = (code *)0x115979;
  system("rm -rf  dummy* > errorlog.txt");
  local_530._8_8_ = (filemgr *)0x0;
  local_530._16_8_ = 0x400;
  local_530._36_4_ = 1;
  local_530[0x2f] = 0;
  local_530[0x40] = 1;
  local_558._16_8_ = &local_560;
  local_560 = (kvs_ops_stat *)0x1234;
  local_558._8_8_ = _cmp_variable;
  pcStack_590 = (code *)0x1159ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)&local_580;
  pcStack_590 = (code *)0x1159ce;
  fVar3 = fdb_open((fdb_file_handle **)pfVar13,"./dummy1",(fdb_config *)pcVar25);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115b92;
  pcStack_590 = (code *)0x1159ea;
  pfVar13 = local_580;
  fVar3 = fdb_kvs_open_default((fdb_file_handle *)local_580,&local_568,(fdb_kvs_config *)local_558);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115b97;
  pcVar23 = "%d";
  handle = (code *)(local_530 + 0xf8);
  unaff_RBP = "000%d";
  pcVar25 = (char *)0x0;
  do {
    cVar15 = (char)uVar26;
    if (cVar15 == '\0') {
      pcStack_590 = (code *)0x115a3b;
      sprintf((char *)handle,"000%d",pcVar25);
      sVar14 = 0x3fc;
      puVar22 = local_434;
    }
    else {
      pcStack_590 = (code *)0x115a1f;
      sprintf((char *)handle,"%d",pcVar25);
      sVar14 = 0x3fe;
      puVar22 = local_437;
    }
    pcStack_590 = (code *)0x115a52;
    memset(puVar22,0x61,sVar14);
    pfVar11 = local_568;
    local_39 = 0;
    pcStack_590 = (code *)0x115a67;
    sVar14 = strlen((char *)handle);
    pcStack_590 = (code *)0x115a7a;
    pfVar13 = pfVar11;
    fVar3 = fdb_set_kv(pfVar11,handle,sVar14,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_590 = (code *)0x115b8d;
      custom_compare_commit_compact();
      goto LAB_00115b8d;
    }
    uVar24 = (int)pcVar25 + 1;
    pcVar25 = (char *)(ulong)uVar24;
  } while (uVar24 != 10);
  pcStack_590 = (code *)0x115a97;
  fdb_compact((fdb_file_handle *)local_580,(char *)0x0);
  pcStack_590 = (code *)0x115aa6;
  fdb_commit((fdb_file_handle *)local_580,'\x01');
  pcStack_590 = (code *)0x115ab2;
  fdb_compact((fdb_file_handle *)local_580,(char *)0x0);
  pcStack_590 = (code *)0x115ad2;
  fdb_iterator_init(local_568,(fdb_iterator **)&local_578,(void *)0x0,0,(void *)0x0,0,0);
  unaff_RBP = (char *)0xffffffff;
  pcVar25 = (char *)&local_570;
  do {
    pcStack_590 = (code *)0x115ae9;
    pfVar13 = local_578;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_578,(fdb_doc **)pcVar25);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115b8d;
    pcStack_590 = (code *)0x115afb;
    fdb_doc_free(local_570);
    local_570 = (fdb_doc *)0x0;
    pcStack_590 = (code *)0x115b0e;
    pfVar13 = local_578;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_578);
    uVar24 = (int)unaff_RBP + 1;
    unaff_RBP = (char *)(ulong)uVar24;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  if (cVar15 != '\0') {
    if (uVar24 == 0) goto LAB_00115b27;
    pcStack_590 = (code *)0x115b22;
    custom_compare_commit_compact();
  }
  if (uVar24 == 9) {
LAB_00115b27:
    pcStack_590 = (code *)0x115b31;
    fdb_iterator_close((fdb_iterator *)local_578);
    pcStack_590 = (code *)0x115b3b;
    fdb_close((fdb_file_handle *)local_580);
    pcStack_590 = (code *)0x115b40;
    fdb_shutdown();
    pcStack_590 = (code *)0x115b45;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (custom_compare_commit_compact(bool)::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pcStack_590 = (code *)0x115b76;
    fprintf(_stderr,pcVar23,"custom compare commit compact");
    return;
  }
  goto LAB_00115b9c;
LAB_001160c3:
  pfStack_9e8 = (fdb_doc *)0x1160c8;
  custom_seqnum_test();
  pfVar10 = (fdb_doc *)pcVar20;
LAB_001160c8:
  pcVar20 = (char *)pfVar10;
  pfStack_9e8 = (fdb_doc *)0x1160cd;
  custom_seqnum_test();
LAB_001160cd:
  pfStack_9e8 = (fdb_doc *)0x1160d8;
  custom_seqnum_test();
LAB_001160d8:
  pfStack_9e8 = (fdb_doc *)0x1160e3;
  custom_seqnum_test();
LAB_001160e3:
  pfStack_9e8 = (fdb_doc *)0x1160e8;
  custom_seqnum_test();
LAB_001160e8:
  pfStack_9e8 = (fdb_doc *)0x1160ed;
  custom_seqnum_test();
LAB_001160ed:
  pfStack_9e8 = (fdb_doc *)0x1160f2;
  custom_seqnum_test();
  goto LAB_001160f2;
LAB_00116697:
  pfStack_fc0 = (fdb_doc *)0x1166a2;
  doc_compression_test();
  pfVar11 = pfVar13;
LAB_001166a2:
  pfVar13 = pfVar11;
  pfStack_fc0 = (fdb_doc *)0x1166a7;
  doc_compression_test();
LAB_001166a7:
  pfStack_fc0 = (fdb_doc *)0x1166b2;
  doc_compression_test();
  pfVar11 = pfVar13;
LAB_001166b2:
  ppfVar12 = &pfStack_fb0;
  pfStack_fc0 = (fdb_doc *)0x1166b7;
  doc_compression_test();
  goto LAB_001166b7;
LAB_001171b8:
  pfStack_1c30 = (fdb_doc *)0x1171bd;
  purge_logically_deleted_doc_test();
LAB_001171bd:
  pfVar19 = pfVar10;
  pfStack_1c30 = (fdb_doc *)0x1171c2;
  purge_logically_deleted_doc_test();
LAB_001171c2:
  pfStack_1c30 = (fdb_doc *)0x1171c7;
  purge_logically_deleted_doc_test();
LAB_001171c7:
  pfStack_1c30 = (fdb_doc *)0x1171d2;
  purge_logically_deleted_doc_test();
LAB_001171d2:
  pfStack_1c30 = (fdb_doc *)0x1171d7;
  purge_logically_deleted_doc_test();
LAB_001171d7:
  pfStack_1c30 = (fdb_doc *)0x1171e2;
  purge_logically_deleted_doc_test();
  pfVar11 = pfVar13;
  pfVar10 = pfVar19;
LAB_001171e2:
  pfStack_1c30 = (fdb_doc *)0x1171e7;
  purge_logically_deleted_doc_test();
  goto LAB_001171e7;
LAB_001174ec:
  pfStack_20b8 = (fdb_doc *)0x1174fc;
  api_wrapper_test();
LAB_001174fc:
  pfStack_20b8 = (fdb_doc *)0x117501;
  api_wrapper_test();
LAB_00117501:
  pfVar13 = (fdb_kvs_handle *)(auStack_2078 + 0x18);
  pfStack_20b8 = (fdb_doc *)0x117506;
  api_wrapper_test();
  goto LAB_00117506;
LAB_00118042:
  pfStack_2b18 = (fdb_encryption_key *)0x118052;
  flush_before_commit_multi_writers_test();
  pfVar19 = pfVar10;
  goto LAB_00118052;
LAB_00118398:
  pfStack_2e90 = (fdb_encryption_key *)0x1183a5;
  auto_commit_test();
  pfVar13 = (fdb_kvs_handle *)pcVar23;
LAB_001183a5:
  pcVar23 = (char *)pfVar13;
  pfStack_2e90 = (fdb_encryption_key *)0x1183aa;
  auto_commit_test();
LAB_001183aa:
  pfStack_2e90 = (fdb_encryption_key *)0x1183b7;
  auto_commit_test();
  pfVar13 = (fdb_kvs_handle *)pcVar23;
LAB_001183b7:
  pfVar10 = afStack_2d38;
  ppfVar12 = apfStack_2e38;
  pfStack_2e90 = (fdb_encryption_key *)0x1183bc;
  auto_commit_test();
  goto LAB_001183bc;
LAB_0011968a:
  pfStack_1dde0 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1dde0 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1dde0 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1dde0 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar11 = (fdb_kvs_handle *)pcVar25;
LAB_0011969e:
  pfStack_1dde0 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1dde0 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1dde0 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1dde0 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1dde0 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
LAB_00115b8d:
  pcStack_590 = (code *)0x115b92;
  custom_compare_commit_compact();
LAB_00115b92:
  pcStack_590 = (code *)0x115b97;
  custom_compare_commit_compact();
LAB_00115b97:
  pcStack_590 = (code *)0x115b9c;
  custom_compare_commit_compact();
LAB_00115b9c:
  pcStack_590 = custom_seqnum_test;
  custom_compare_commit_compact();
  pcVar20 = (char *)((ulong)pfVar13 & 0xffffffff);
  pfStack_9e8 = (fdb_doc *)0x115bc3;
  uStack_5b8 = uVar26;
  pfStack_5b0 = (fdb_kvs_handle *)pcVar23;
  pfStack_5a8 = (fdb_kvs_handle *)handle;
  pfStack_5a0 = (fdb_kvs_handle *)pcVar25;
  pfStack_598 = pfVar11;
  pcStack_590 = (code *)unaff_RBP;
  gettimeofday((timeval *)(auStack_978 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_9e8 = (fdb_doc *)0x115bc8;
  memleak_start();
  pfStack_9c8 = &fStack_700;
  fStack_700.seqnum = 0;
  fStack_700.deleted = false;
  fStack_700._73_3_ = 0;
  fStack_700.flags = 0;
  fStack_700.keylen = 0;
  fStack_700.metalen = 0;
  fStack_700.bodylen = 0;
  fStack_700.size_ondisk = 0;
  fStack_700.offset = 0;
  fStack_700.meta = (void *)0x0;
  fStack_700.key = auStack_900 + 0x100;
  fStack_700.body = auStack_900;
  pfStack_9e8 = (fdb_doc *)0x115c0f;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar16 = (fdb_kvs_handle *)&stack0xfffffffffffff950;
  pfStack_9e8 = (fdb_doc *)0x115c1f;
  fdb_get_default_config();
  pfStack_9e8 = (fdb_doc *)0x115c29;
  fdb_get_default_kvs_config();
  p_Stack_6a8 = (fdb_custom_cmp_variable)0x0;
  pvStack_6a0 = (void *)0x400;
  uStack_68c = 1;
  uStack_690 = 1;
  uStack_681 = 0;
  aaStack_670[0]._0_1_ = SUB81(pcVar20,0);
  pfStack_9e8 = (fdb_doc *)0x115c60;
  fdb_open(&pfStack_9c0,"./dummy1",(fdb_config *)pfVar16);
  iStack_9b4 = (int)pfVar13;
  if (iStack_9b4 != 0) {
    pcVar25 = (char *)0x3;
    pfVar16 = (fdb_kvs_handle *)0x18;
    pfVar11 = (fdb_kvs_handle *)auStack_9b0;
    pcVar23 = auStack_978;
    handle = logCallbackFunc;
    pcVar20 = "custom_seqnum_test";
    do {
      pfStack_9e8 = (fdb_doc *)0x115ca3;
      sprintf((char *)pfVar11,"kv%d",(ulong)pcVar25 & 0xffffffff);
      pfStack_9e8 = (fdb_doc *)0x115cbb;
      fVar3 = fdb_kvs_open(pfStack_9c0,
                           (fdb_kvs_handle **)
                           (auStack_9b0 + 0x10 + (long)&(pfVar16->kvs_config).create_if_missing),
                           (char *)pfVar11,(fdb_kvs_config *)pcVar23);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001160ed;
      pfStack_9e8 = (fdb_doc *)0x115cd3;
      fVar3 = fdb_set_log_callback
                        (*(fdb_kvs_handle **)(auStack_9b0 + (long)pcVar25 * 8 + 0x10),
                         logCallbackFunc,"custom_seqnum_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001160e8;
      pfVar16 = (fdb_kvs_handle *)&pfVar16[-1].bub_ctx.handle;
      bVar29 = (fdb_kvs_handle *)pcVar25 != (fdb_kvs_handle *)0x0;
      pcVar25 = (char *)((long)&(((fdb_kvs_handle *)((long)pcVar25 + -0x208))->bub_ctx).handle + 7);
    } while (bVar29);
    pfVar13 = (fdb_kvs_handle *)0x4;
LAB_00115d2d:
    pfVar11 = (fdb_kvs_handle *)(auStack_900 + 0x100);
    pcVar23 = "body%d";
    pcVar20 = (char *)0x0;
    do {
      pfStack_9e8 = (fdb_doc *)0x115d60;
      sprintf((char *)pfVar11,"key%d",(ulong)pcVar20 & 0xffffffff);
      pfStack_9e8 = (fdb_doc *)0x115d6f;
      sprintf((char *)auStack_900,"body%d",(ulong)pcVar20 & 0xffffffff);
      pfVar16 = (fdb_kvs_handle *)(auStack_950 + (long)pcVar20 * 8);
      pfStack_9e8 = (fdb_doc *)0x115d82;
      sVar14 = strlen((char *)pfVar11);
      pfStack_9e8 = (fdb_doc *)0x115d8e;
      sVar5 = strlen((char *)auStack_900);
      pfStack_9e8 = (fdb_doc *)0x115dab;
      fdb_doc_create((fdb_doc **)pfVar16,pfVar11,sVar14 + 1,(void *)0x0,0,
                     (fdb_kvs_handle *)auStack_900,sVar5 + 1);
      pcVar25 = (char *)pfVar13;
      while (0 < (long)pcVar25) {
        lVar17 = (long)pcVar25 * 8;
        pcVar25 = (char *)((long)&(((fdb_kvs_handle *)((long)pcVar25 + -0x208))->bub_ctx).handle + 7
                          );
        pfStack_9e8 = (fdb_doc *)0x115dc5;
        fVar3 = fdb_set(*(fdb_kvs_handle **)(auStack_9b0 + lVar17 + 8),
                        *(fdb_doc **)&pfVar16->kvs_config);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_9e8 = (fdb_doc *)0x1160c3;
          custom_seqnum_test();
          handle = (code *)auStack_900;
          goto LAB_001160c3;
        }
      }
      pcVar20 = (char *)((long)&((fdb_doc *)pcVar20)->keylen + 1);
    } while ((fdb_doc *)pcVar20 != (fdb_doc *)0x5);
    pcVar25 = (char *)0x5;
    pcVar20 = auStack_900;
    do {
      pcVar23 = auStack_900 + 0x100;
      pfStack_9e8 = (fdb_doc *)0x115e05;
      sprintf(pcVar23,"key%d",(ulong)pcVar25 & 0xffffffff);
      pfStack_9e8 = (fdb_doc *)0x115e19;
      sprintf(pcVar20,"body%d",(ulong)pcVar25 & 0xffffffff);
      pfVar16 = (fdb_kvs_handle *)(auStack_950 + (long)pcVar25 * 8);
      pfStack_9e8 = (fdb_doc *)0x115e2c;
      sVar14 = strlen(pcVar23);
      pfStack_9e8 = (fdb_doc *)0x115e38;
      sVar5 = strlen(pcVar20);
      pfStack_9e8 = (fdb_doc *)0x115e55;
      fdb_doc_create((fdb_doc **)pfVar16,pcVar23,sVar14 + 1,(void *)0x0,0,pcVar20,sVar5 + 1);
      pfVar11 = (fdb_kvs_handle *)((long)pcVar25 * 2 + 2);
      handle = (code *)pfVar13;
      while (0 < (long)handle) {
        pcVar23 = (char *)((long)&(((fdb_kvs_handle *)((long)handle + -0x208))->bub_ctx).handle + 7)
        ;
        pfStack_9e8 = (fdb_doc *)0x115e76;
        fdb_doc_set_seqnum(*(fdb_doc **)&pfVar16->kvs_config,(fdb_seqnum_t)pfVar11);
        pfStack_9e8 = (fdb_doc *)0x115e83;
        fVar3 = fdb_set(*(fdb_kvs_handle **)(auStack_9b0 + (long)handle * 8 + 8),
                        *(fdb_doc **)&pfVar16->kvs_config);
        handle = (code *)pcVar23;
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001160c3;
      }
      pcVar25 = &(((fdb_kvs_handle *)pcVar25)->kvs_config).field_0x1;
    } while (pcVar25 != (undefined1 *)0xa);
    phVar6 = (hbtrie *)(ulong)((int)pfVar13 - 1);
    phVar7 = phVar6;
    do {
      auStack_9b0._48_8_ = phVar7;
      pfStack_9e8 = (fdb_doc *)0x115ecd;
      fdb_iterator_init(*(fdb_kvs_handle **)(auStack_9b0 + (long)phVar7 * 8 + 0x10),
                        (fdb_iterator **)auStack_9b0,(void *)0x0,0,(void *)0x0,0,0);
      pcVar23 = (char *)0x2;
      pcVar25 = (char *)(fdb_kvs_handle *)0x0;
      pfVar10 = (fdb_doc *)pcVar20;
      do {
        pfStack_9e8 = (fdb_doc *)0x115ee7;
        fVar3 = fdb_iterator_get((fdb_iterator *)auStack_9b0._0_8_,&pfStack_9c8);
        pcVar20 = (char *)pfStack_9c8;
        pfVar16 = (fdb_kvs_handle *)pcVar25;
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001160c8;
        pfVar16 = (fdb_kvs_handle *)pfStack_9c8->key;
        pfVar11 = *(fdb_kvs_handle **)(auStack_950 + (long)pcVar25 * 8);
        handle = (code *)pfVar11->op_stats;
        pfStack_9e8 = (fdb_doc *)0x115f13;
        iVar4 = bcmp(pfVar16,handle,pfStack_9c8->keylen);
        if (iVar4 != 0) goto LAB_001160cd;
        pfVar16 = (fdb_kvs_handle *)((fdb_doc *)pcVar20)->body;
        handle = (code *)(pfVar11->field_6).seqtree;
        pfStack_9e8 = (fdb_doc *)0x115f32;
        iVar4 = bcmp(pfVar16,handle,((fdb_doc *)pcVar20)->bodylen);
        if (iVar4 != 0) goto LAB_001160d8;
        puVar22 = &(((fdb_kvs_handle *)pcVar25)->kvs_config).field_0x1;
        if (pcVar25 < (fdb_kvs_handle *)0x5) {
          if ((fdb_kvs_handle *)puVar22 != (fdb_kvs_handle *)((fdb_doc *)pcVar20)->seqnum) {
            pfStack_9e8 = (fdb_doc *)0x115f5a;
            custom_seqnum_test();
          }
        }
        else if ((fdb_kvs_handle *)pcVar23 != (fdb_kvs_handle *)((fdb_doc *)pcVar20)->seqnum) {
          pfStack_9e8 = (fdb_doc *)0x115f87;
          custom_seqnum_test();
        }
        pfStack_9e8 = (fdb_doc *)0x115f6b;
        fVar3 = fdb_iterator_next((fdb_iterator *)auStack_9b0._0_8_);
        pcVar23 = &(((fdb_kvs_handle *)pcVar23)->kvs_config).field_0x2;
        pcVar25 = puVar22;
        pfVar10 = (fdb_doc *)pcVar20;
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      pfStack_9e8 = (fdb_doc *)0x115f93;
      fdb_iterator_close((fdb_iterator *)auStack_9b0._0_8_);
      pfStack_9e8 = (fdb_doc *)0x115fa2;
      fdb_commit(pfStack_9c0,'\x01');
      phVar7 = (hbtrie *)((long)&((hbtrie *)(auStack_9b0._48_8_ + -0x70))->last_map_chunk + 7);
    } while (0 < (long)auStack_9b0._48_8_);
    pfStack_9e8 = (fdb_doc *)0x115fc5;
    fdb_compact(pfStack_9c0,"./dummy2");
    pfVar16 = (fdb_kvs_handle *)0x5;
    pcVar25 = "key%d";
    pfVar11 = (fdb_kvs_handle *)(auStack_900 + 0x100);
    do {
      pfStack_9e8 = (fdb_doc *)0x115fed;
      sprintf((char *)pfVar11,"key%d",(ulong)pfVar16 & 0xffffffff);
      pcVar23 = (char *)((long)pfVar16 * 2 + 2);
      handle = (code *)&phVar6->valuelen;
      do {
        pfStack_9c8->seqnum = (fdb_seqnum_t)pcVar23;
        pfStack_9e8 = (fdb_doc *)0x11600d;
        fVar3 = fdb_get_byseq(*(fdb_kvs_handle **)(auStack_9b0 + (long)handle * 8 + 8),pfStack_9c8);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001160e3;
        pfVar13 = (fdb_kvs_handle *)
                  ((long)&(((fdb_kvs_handle *)((long)handle + -0x208))->bub_ctx).handle + 7);
        bVar29 = 0 < (long)handle;
        handle = (code *)pfVar13;
      } while (pfVar13 != (fdb_kvs_handle *)0x0 && bVar29);
      pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
      if (pfVar16 == (fdb_kvs_handle *)0xa) {
        pfStack_9e8 = (fdb_doc *)0x11602d;
        fdb_close(pfStack_9c0);
        lVar17 = 0;
        do {
          pfStack_9e8 = (fdb_doc *)0x11603c;
          fdb_doc_free(*(fdb_doc **)(auStack_950 + lVar17 * 8));
          lVar17 = lVar17 + 1;
        } while (lVar17 != 10);
        pfStack_9e8 = (fdb_doc *)0x11604a;
        fdb_shutdown();
        pfStack_9e8 = (fdb_doc *)0x11604f;
        memleak_end();
        pcVar23 = "single kv instance";
        if ((char)iStack_9b4 != '\0') {
          pcVar23 = "multiple kv instances";
        }
        pfStack_9e8 = (fdb_doc *)0x11607f;
        sprintf(auStack_900,"Custom sequence number test %s",pcVar23);
        pcVar23 = "%s PASSED\n";
        if (custom_seqnum_test(bool)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pfStack_9e8 = (fdb_doc *)0x1160ac;
        fprintf(_stderr,pcVar23,auStack_900);
        return;
      }
    } while( true );
  }
  pfStack_9e8 = (fdb_doc *)0x115d00;
  fVar3 = fdb_kvs_open_default
                    (pfStack_9c0,(fdb_kvs_handle **)(auStack_9b0 + 0x10),
                     (fdb_kvs_config *)auStack_978);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_9e8 = (fdb_doc *)0x115d20;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_9b0._16_8_,logCallbackFunc,"custom_seqnum_test");
    pfVar13 = (fdb_kvs_handle *)0x1;
    if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00115d2d;
  }
  else {
LAB_001160f2:
    pfStack_9e8 = (fdb_doc *)0x1160f7;
    custom_seqnum_test();
  }
  pfStack_9e8 = (fdb_doc *)doc_compression_test;
  custom_seqnum_test();
  pfStack_fc0 = (fdb_doc *)0x11611f;
  pfStack_a10 = pfVar16;
  pfStack_a08 = (fdb_kvs_handle *)pcVar23;
  pfStack_a00 = (fdb_kvs_handle *)handle;
  pfStack_9f8 = (fdb_kvs_handle *)pcVar25;
  pfStack_9f0 = pfVar11;
  pfStack_9e8 = (fdb_doc *)pcVar20;
  gettimeofday((timeval *)(auStack_f40 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_fc0 = (fdb_doc *)0x116124;
  memleak_start();
  pfStack_fb0 = (fdb_kvs_handle *)0x0;
  pfStack_fc0 = (fdb_doc *)0x116135;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_fc0 = (fdb_doc *)0x116145;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)auStack_f40;
  pfStack_fc0 = (fdb_doc *)0x116152;
  fdb_get_default_kvs_config();
  fStack_c10.buffercache_size = 0;
  fStack_c10.wal_threshold = 0x400;
  fStack_c10.flags = 1;
  fStack_c10.compress_document_body = true;
  fStack_c10.compaction_threshold = '\0';
  fStack_c10.purging_interval = 1;
  pbVar8 = (btree *)(auStack_fa8 + 8);
  pfStack_fc0 = (fdb_doc *)0x116188;
  fdb_open((fdb_file_handle **)pbVar8,"./dummy1",&fStack_c10);
  ppfVar12 = (fdb_kvs_handle **)auStack_fa8;
  pfStack_fc0 = (fdb_doc *)0x11619b;
  fdb_kvs_open_default((fdb_file_handle *)auStack_fa8._8_8_,ppfVar12,(fdb_kvs_config *)pfVar11);
  pfStack_fc0 = (fdb_doc *)0x1161b1;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_fa8._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    uStack_e08 = 0x6161616161616161;
    psStack_e00 = (snap_handle *)0x6161616161616161;
    uStack_e18 = 0x6161616161616161;
    uStack_e10 = 0x6161616161616161;
    uStack_df8 = uStack_df8 & 0xffffff00;
    handle = (code *)0x0;
    uVar26 = 0;
    do {
      pfStack_fc0 = (fdb_doc *)0x1161f5;
      sprintf(acStack_b18,"key%d",uVar26 & 0xffffffff);
      pfStack_fc0 = (fdb_doc *)0x11620e;
      sprintf(acStack_d18,"meta%d",uVar26 & 0xffffffff);
      pfStack_fc0 = (fdb_doc *)0x11622f;
      sprintf(auStack_f18,"body%d_%s",uVar26 & 0xffffffff,&uStack_e18);
      pcVar23 = auStack_f98 + (long)handle;
      pfStack_fc0 = (fdb_doc *)0x11623f;
      pcVar20 = (char *)strlen(acStack_b18);
      pfStack_fc0 = (fdb_doc *)0x116252;
      pbVar8 = (btree *)strlen(acStack_d18);
      pfStack_fc0 = (fdb_doc *)0x116262;
      sVar14 = strlen(auStack_f18);
      pfStack_fc0 = (fdb_doc *)0x116287;
      fdb_doc_create((fdb_doc **)pcVar23,acStack_b18,(size_t)pcVar20,acStack_d18,(size_t)pbVar8,
                     auStack_f18,sVar14);
      pfStack_fc0 = (fdb_doc *)0x116296;
      fdb_set((fdb_kvs_handle *)auStack_fa8._0_8_,*(fdb_doc **)(auStack_f98 + uVar26 * 8));
      uVar26 = uVar26 + 1;
      handle = (code *)((long)handle + 8);
    } while (uVar26 != 10);
    keylen._0_1_ = pbStack_f70->ksize;
    keylen._1_1_ = pbStack_f70->vsize;
    keylen._2_2_ = pbStack_f70->height;
    keylen._4_4_ = pbStack_f70->blksize;
    ppfVar12 = &pfStack_fb0;
    pfStack_fc0 = (fdb_doc *)0x1162d3;
    fdb_doc_create((fdb_doc **)ppfVar12,pbStack_f70->kv_ops,keylen,*(void **)(pbStack_f70 + 1),
                   pbStack_f70->root_bid,(void *)0x0,0);
    pfStack_fc0 = (fdb_doc *)0x1162e0;
    fVar3 = fdb_del((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)pfStack_fb0);
    pfVar11 = (fdb_kvs_handle *)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001166bc;
    pfStack_fc0 = (fdb_doc *)0x1162f2;
    fdb_doc_free((fdb_doc *)pfStack_fb0);
    pfStack_fb0 = (fdb_kvs_handle *)0x0;
    ppfVar12 = (fdb_kvs_handle **)(auStack_fa8 + 8);
    pfStack_fc0 = (fdb_doc *)0x11630a;
    fdb_commit((fdb_file_handle *)auStack_fa8._8_8_,'\0');
    pfVar11 = (fdb_kvs_handle *)auStack_fa8;
    pfStack_fc0 = (fdb_doc *)0x116317;
    fdb_kvs_close((fdb_kvs_handle *)auStack_fa8._0_8_);
    pfStack_fc0 = (fdb_doc *)0x11631f;
    fdb_close((fdb_file_handle *)auStack_fa8._8_8_);
    pfStack_fc0 = (fdb_doc *)0x116336;
    fdb_open((fdb_file_handle **)ppfVar12,"./dummy1",&fStack_c10);
    pfStack_fc0 = (fdb_doc *)0x116346;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_fa8._8_8_,(fdb_kvs_handle **)pfVar11,
               (fdb_kvs_config *)auStack_f40);
    pfStack_fc0 = (fdb_doc *)0x11635c;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_fa8._0_8_,logCallbackFunc,"doc_compression_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      uStack_de8 = 0x62626262;
      uStack_de4 = 0x62626262;
      uStack_de0 = 0x62626262;
      uStack_ddc = 0x62626262;
      uStack_df8 = 0x62626262;
      uStack_df4 = 0x62626262;
      uStack_df0 = 0x62626262;
      uStack_dec = 0x62626262;
      uStack_e08 = 0x6262626262626262;
      psStack_e00 = (snap_handle *)0x6262626262626262;
      uStack_e18 = 0x6262626262626262;
      uStack_e10 = 0x6262626262626262;
      aStack_dd8.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'\0';
      handle = (code *)0x0;
      pfStack_fc0 = (fdb_doc *)0x1163a9;
      sprintf(acStack_d18,"newmeta%d",0);
      pfStack_fc0 = (fdb_doc *)0x1163c7;
      sprintf((char *)auStack_f18,"newbody%d_%s",0,&uStack_e18);
      pfStack_fc0 = (fdb_doc *)0x1163cf;
      pcVar20 = (char *)strlen(acStack_d18);
      pfStack_fc0 = (fdb_doc *)0x1163da;
      sVar14 = strlen((char *)auStack_f18);
      pfStack_fc0 = (fdb_doc *)0x1163f3;
      fdb_doc_update((fdb_doc **)auStack_f98,acStack_d18,(size_t)pcVar20,
                     (fdb_kvs_handle *)auStack_f18,sVar14);
      pfStack_fc0 = (fdb_doc *)0x116401;
      fdb_set((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)auStack_f98._0_8_);
      pfStack_fc0 = (fdb_doc *)0x116417;
      sprintf(acStack_d18,"newmeta%d",1);
      pfStack_fc0 = (fdb_doc *)0x116430;
      sprintf((char *)auStack_f18,"newbody%d_%s",1,&uStack_e18);
      pbVar8 = (btree *)(auStack_f98 + 8);
      pfStack_fc0 = (fdb_doc *)0x11643d;
      pcVar23 = (char *)strlen(acStack_d18);
      pfStack_fc0 = (fdb_doc *)0x116448;
      sVar14 = strlen((char *)auStack_f18);
      pfStack_fc0 = (fdb_doc *)0x11645c;
      fdb_doc_update((fdb_doc **)pbVar8,acStack_d18,(size_t)pcVar23,(fdb_kvs_handle *)auStack_f18,
                     sVar14);
      pfStack_fc0 = (fdb_doc *)0x116469;
      fdb_set((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)auStack_f98._8_8_);
      pfStack_fc0 = (fdb_doc *)0x116475;
      fdb_commit((fdb_file_handle *)auStack_fa8._8_8_,'\0');
      pfVar13 = (fdb_kvs_handle *)auStack_f18;
      do {
        pfStack_fc0 = (fdb_doc *)0x11649e;
        fdb_doc_create((fdb_doc **)&pfStack_fb0,
                       (void *)(*(size_t **)(auStack_f98 + (long)handle * 8))[4],
                       **(size_t **)(auStack_f98 + (long)handle * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_fc0 = (fdb_doc *)0x1164ad;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)pfStack_fb0);
        pfVar11 = pfStack_fb0;
        if ((fdb_kvs_handle *)handle != (fdb_kvs_handle *)0x5) {
          if (fVar3 == FDB_RESULT_SUCCESS) {
            pbVar8 = pfStack_fb0->staletree;
            pcVar20 = *(char **)(auStack_f98 + (long)handle * 8);
            pcVar23 = (char *)((fdb_doc *)pcVar20)->meta;
            pfStack_fc0 = (fdb_doc *)0x1164ec;
            iVar4 = bcmp(pbVar8,pcVar23,(size_t)(pfStack_fb0->kvs_config).custom_cmp);
            if (iVar4 == 0) {
              pbVar8 = (pfVar11->field_6).seqtree;
              pcVar23 = (char *)((fdb_doc *)pcVar20)->body;
              pfStack_fc0 = (fdb_doc *)0x11650b;
              iVar4 = bcmp(pbVar8,pcVar23,(size_t)(pfVar11->kvs_config).custom_cmp_param);
              if (iVar4 == 0) goto LAB_00116513;
              pfStack_fc0 = (fdb_doc *)0x116682;
              doc_compression_test();
              pfVar13 = pfVar11;
              goto LAB_00116682;
            }
          }
          else {
LAB_00116682:
            pfVar11 = pfVar13;
            pfStack_fc0 = (fdb_doc *)0x116687;
            doc_compression_test();
          }
          pfStack_fc0 = (fdb_doc *)0x116692;
          doc_compression_test();
          pfVar13 = pfVar11;
LAB_00116692:
          pfStack_fc0 = (fdb_doc *)0x116697;
          doc_compression_test();
          goto LAB_00116697;
        }
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116692;
LAB_00116513:
        pfStack_fc0 = (fdb_doc *)0x11651b;
        fdb_doc_free((fdb_doc *)pfVar11);
        pfStack_fb0 = (fdb_kvs_handle *)0x0;
        handle = (code *)&(((fdb_kvs_handle *)handle)->kvs_config).field_0x1;
        pfVar13 = pfVar11;
      } while (handle != (code *)0xa);
      pfStack_fc0 = (fdb_doc *)0x116542;
      fdb_compact((fdb_file_handle *)auStack_fa8._8_8_,"./dummy2");
      handle = (code *)0x0;
      do {
        pfStack_fc0 = (fdb_doc *)0x11656e;
        fdb_doc_create((fdb_doc **)&pfStack_fb0,
                       (void *)(*(size_t **)(auStack_f98 + (long)handle * 8))[4],
                       **(size_t **)(auStack_f98 + (long)handle * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_fc0 = (fdb_doc *)0x11657d;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)pfStack_fb0);
        pfVar13 = pfStack_fb0;
        if ((fdb_kvs_handle *)handle == (fdb_kvs_handle *)0x5) {
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001166b2;
        }
        else {
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001166a2;
          pbVar8 = pfStack_fb0->staletree;
          pcVar20 = *(char **)(auStack_f98 + (long)handle * 8);
          pcVar23 = (char *)((fdb_doc *)pcVar20)->meta;
          pfStack_fc0 = (fdb_doc *)0x1165bc;
          iVar4 = bcmp(pbVar8,pcVar23,(size_t)(pfStack_fb0->kvs_config).custom_cmp);
          if (iVar4 != 0) goto LAB_001166a7;
          pbVar8 = (pfVar13->field_6).seqtree;
          pcVar23 = (char *)((fdb_doc *)pcVar20)->body;
          pfStack_fc0 = (fdb_doc *)0x1165db;
          iVar4 = bcmp(pbVar8,pcVar23,(size_t)(pfVar13->kvs_config).custom_cmp_param);
          if (iVar4 != 0) goto LAB_00116697;
        }
        pfStack_fc0 = (fdb_doc *)0x1165eb;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_fb0 = (fdb_kvs_handle *)0x0;
        handle = (code *)&(((fdb_kvs_handle *)handle)->kvs_config).field_0x1;
        pfVar11 = pfVar13;
        if (handle == (code *)0xa) {
          lVar17 = 0;
          do {
            pfStack_fc0 = (fdb_doc *)0x11660d;
            fdb_doc_free(*(fdb_doc **)(auStack_f98 + lVar17 * 8));
            lVar17 = lVar17 + 1;
          } while (lVar17 != 10);
          pfStack_fc0 = (fdb_doc *)0x116620;
          fdb_kvs_close((fdb_kvs_handle *)auStack_fa8._0_8_);
          pfStack_fc0 = (fdb_doc *)0x11662a;
          fdb_close((fdb_file_handle *)auStack_fa8._8_8_);
          pfStack_fc0 = (fdb_doc *)0x11662f;
          fdb_shutdown();
          pfStack_fc0 = (fdb_doc *)0x116634;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (doc_compression_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_fc0 = (fdb_doc *)0x116665;
          fprintf(_stderr,pcVar23,"document compression test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001166b7:
    pfStack_fc0 = (fdb_doc *)0x1166bc;
    doc_compression_test();
LAB_001166bc:
    pfStack_fc0 = (fdb_doc *)0x1166c1;
    doc_compression_test();
  }
  pfStack_fc0 = (fdb_doc *)read_doc_by_offset_test;
  doc_compression_test();
  pfStack_1768 = (fdb_doc *)0x1166e3;
  ppfStack_fe8 = ppfVar12;
  pfStack_fe0 = (fdb_kvs_handle *)pcVar23;
  pfStack_fd8 = (fdb_kvs_handle *)handle;
  pfStack_fd0 = pfVar11;
  pbStack_fc8 = pbVar8;
  pfStack_fc0 = (fdb_doc *)pcVar20;
  gettimeofday(&tStack_1728,(__timezone_ptr_t)0x0);
  pfStack_1768 = (fdb_doc *)0x1166e8;
  memleak_start();
  pfStack_1768 = (fdb_doc *)0x1166f4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1768 = (fdb_doc *)0x116704;
  fdb_get_default_config();
  pbVar8 = (btree *)auStack_1718;
  pfStack_1768 = (fdb_doc *)0x116711;
  fdb_get_default_kvs_config();
  fStack_10e0.buffercache_size = 0;
  fStack_10e0.wal_threshold = 0x400;
  fStack_10e0.flags = 1;
  fStack_10e0.purging_interval = 0xe10;
  fStack_10e0.compaction_threshold = '\0';
  pfVar10 = (fdb_doc *)auStack_1740;
  pfStack_1768 = (fdb_doc *)0x11674a;
  fdb_open((fdb_file_handle **)pfVar10,"./dummy1",&fStack_10e0);
  pfVar19 = (fdb_doc *)(auStack_1750 + 8);
  pfStack_1768 = (fdb_doc *)0x11675d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1740._0_8_,(fdb_kvs_handle **)pfVar19,
             (fdb_kvs_config *)pbVar8);
  pfStack_1768 = (fdb_doc *)0x116773;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1750._8_8_,logCallbackFunc,"read_doc_by_offset_test")
  ;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar17 = 0;
    uVar26 = 0;
    do {
      pfStack_1768 = (fdb_doc *)0x11679b;
      sprintf(acStack_11e0,"key%d",uVar26 & 0xffffffff);
      pfStack_1768 = (fdb_doc *)0x1167b3;
      sprintf((char *)abStack_12e0,"meta%d",uVar26 & 0xffffffff);
      pfStack_1768 = (fdb_doc *)0x1167c8;
      sprintf(auStack_1718 + 0x18,"body%d",uVar26 & 0xffffffff);
      pfStack_1768 = (fdb_doc *)0x1167db;
      sVar14 = strlen(acStack_11e0);
      pfStack_1768 = (fdb_doc *)0x1167ee;
      sVar5 = strlen((char *)abStack_12e0);
      pfStack_1768 = (fdb_doc *)0x1167fb;
      sVar9 = strlen(auStack_1718 + 0x18);
      pfStack_1768 = (fdb_doc *)0x11681d;
      fdb_doc_create((fdb_doc **)((long)&afStack_1600[0].keylen + lVar17),acStack_11e0,sVar14,
                     abStack_12e0,sVar5,auStack_1718 + 0x18,sVar9);
      pfStack_1768 = (fdb_doc *)0x11682f;
      fdb_set((fdb_kvs_handle *)auStack_1750._8_8_,(fdb_doc *)(&afStack_1600[0].keylen)[uVar26]);
      uVar26 = uVar26 + 1;
      lVar17 = lVar17 + 8;
    } while (uVar26 != 100);
    pfStack_1768 = (fdb_doc *)0x11684c;
    fdb_commit((fdb_file_handle *)auStack_1740._0_8_,'\0');
    pbVar8 = abStack_12e0;
    pcVar23 = auStack_1718 + 0x18;
    pfVar10 = (fdb_doc *)0x0;
    uVar26 = 0;
    do {
      pfStack_1768 = (fdb_doc *)0x116873;
      sprintf((char *)pbVar8,"meta2%d",uVar26 & 0xffffffff);
      pfStack_1768 = (fdb_doc *)0x116887;
      sprintf(pcVar23,"body2%d",uVar26 & 0xffffffff);
      pcVar20 = (char *)((long)&afStack_1600[0].keylen + (long)pfVar10);
      pfStack_1768 = (fdb_doc *)0x11689a;
      sVar14 = strlen((char *)pbVar8);
      pfStack_1768 = (fdb_doc *)0x1168a5;
      sVar5 = strlen(pcVar23);
      pfStack_1768 = (fdb_doc *)0x1168b9;
      fdb_doc_update((fdb_doc **)pcVar20,pbVar8,sVar14,pcVar23,sVar5);
      pfStack_1768 = (fdb_doc *)0x1168cb;
      fdb_set((fdb_kvs_handle *)auStack_1750._8_8_,(fdb_doc *)(&afStack_1600[0].keylen)[uVar26]);
      uVar26 = uVar26 + 1;
      pfVar10 = (fdb_doc *)((long)pfVar10 + 8);
    } while (uVar26 != 0x32);
    pfVar19 = (fdb_doc *)auStack_1750;
    pfStack_1768 = (fdb_doc *)0x116907;
    fdb_doc_create((fdb_doc **)pfVar19,(void *)psStack_1470[4],*psStack_1470,(void *)psStack_1470[7]
                   ,psStack_1470[1],(void *)0x0,0);
    pfStack_1768 = (fdb_doc *)0x116914;
    fVar3 = fdb_del((fdb_kvs_handle *)auStack_1750._8_8_,(fdb_doc *)auStack_1750._0_8_);
    handle = (code *)0x32;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c56;
    pfVar19 = (fdb_doc *)auStack_1750;
    pfStack_1768 = (fdb_doc *)0x116929;
    fdb_doc_free((fdb_doc *)auStack_1750._0_8_);
    pbVar8 = (btree *)0x0;
    auStack_1750._0_8_ = (fdb_doc *)0x0;
    pfStack_1768 = (fdb_doc *)0x11693b;
    fdb_commit((fdb_file_handle *)auStack_1740._0_8_,'\0');
    pfStack_1768 = (fdb_doc *)0x11695e;
    fdb_doc_create((fdb_doc **)pfVar19,*(kvs_ops_stat **)(afStack_1600[0].seqnum + 0x20),
                   *(size_t *)(fdb_kvs_config *)afStack_1600[0].seqnum,(void *)0x0,0,(void *)0x0,0);
    pfStack_1768 = (fdb_doc *)0x11696b;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_1750._8_8_,(fdb_doc *)auStack_1750._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c5b;
    pfVar19 = (fdb_doc *)auStack_1750._0_8_;
    if (*(bool *)(auStack_1750._0_8_ + 0x48) != false) {
      pfStack_1768 = (fdb_doc *)0x116990;
      read_doc_by_offset_test();
      pfVar19 = (fdb_doc *)auStack_1740._8_8_;
    }
    pbVar8 = (btree *)pfVar19->meta;
    pfVar10 = *(fdb_doc **)(afStack_1600[0].seqnum + 0x38);
    pfStack_1768 = (fdb_doc *)0x1169b2;
    iVar4 = bcmp(pbVar8,pfVar10,pfVar19->metalen);
    if (iVar4 != 0) goto LAB_00116c60;
    pfStack_1768 = (fdb_doc *)0x1169c7;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_1750._8_8_,pfVar19);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c6b;
    pfVar10 = (fdb_doc *)auStack_1750._0_8_;
    if (*(bool *)(auStack_1750._0_8_ + 0x48) != false) {
      pfStack_1768 = (fdb_doc *)0x1169ed;
      read_doc_by_offset_test();
      pfVar10 = (fdb_doc *)auStack_1740._8_8_;
    }
    pcVar23 = (char *)afStack_1600[0].seqnum;
    pfVar19 = (fdb_doc *)pfVar10->meta;
    pbVar8 = *(btree **)(afStack_1600[0].seqnum + 0x38);
    pfStack_1768 = (fdb_doc *)0x116a10;
    iVar4 = bcmp(pfVar19,pbVar8,pfVar10->metalen);
    if (iVar4 != 0) goto LAB_00116c70;
    pfVar19 = (fdb_doc *)pfVar10->body;
    pbVar8 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar23 + 0x40))->seqtree;
    pfStack_1768 = (fdb_doc *)0x116a30;
    iVar4 = bcmp(pfVar19,pbVar8,pfVar10->bodylen);
    if (iVar4 != 0) goto LAB_00116c7b;
    pfVar19 = (fdb_doc *)(auStack_1740 + 0x10);
    pfStack_1768 = (fdb_doc *)0x116a59;
    fdb_doc_create((fdb_doc **)pfVar19,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(auStack_1740._16_8_ + 0x30) = *(uint64_t *)(auStack_1750._0_8_ + 0x30);
    pfStack_1768 = (fdb_doc *)0x116a73;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_1750._8_8_,(fdb_doc *)auStack_1740._16_8_);
    pfVar27 = (fdb_doc *)auStack_1740._16_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c86;
    pfVar19 = *(fdb_doc **)(auStack_1740._16_8_ + 0x20);
    pbVar8 = *(btree **)(afStack_1600[0].seqnum + 0x20);
    pfStack_1768 = (fdb_doc *)0x116a9f;
    iVar4 = bcmp(pfVar19,pbVar8,(size_t)*(size_t *)auStack_1740._16_8_);
    pcVar23 = (char *)afStack_1600[0].seqnum;
    if (iVar4 != 0) goto LAB_00116c8b;
    pfVar19 = *(fdb_doc **)((long)pfVar27 + 0x38);
    pbVar8 = *(btree **)(afStack_1600[0].seqnum + 0x38);
    pfStack_1768 = (fdb_doc *)0x116abf;
    iVar4 = bcmp(pfVar19,pbVar8,*(size_t *)((long)pfVar27 + 8));
    if (iVar4 != 0) goto LAB_00116c96;
    pfVar19 = *(fdb_doc **)((long)pfVar27 + 0x40);
    pbVar8 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(afStack_1600[0].seqnum + 0x40))->
             seqtree;
    pfStack_1768 = (fdb_doc *)0x116adf;
    iVar4 = bcmp(pfVar19,pbVar8,*(size_t *)((long)pfVar27 + 0x10));
    if (iVar4 != 0) goto LAB_00116ca1;
    pfVar19 = (fdb_doc *)auStack_1750;
    pfStack_1768 = (fdb_doc *)0x116af4;
    fdb_doc_free((fdb_doc *)auStack_1750._0_8_);
    pbVar8 = (btree *)0x0;
    auStack_1750._0_8_ = (fdb_doc *)0x0;
    pfStack_1768 = (fdb_doc *)0x116b04;
    fdb_doc_free((fdb_doc *)auStack_1740._16_8_);
    pfStack_1768 = (fdb_doc *)0x116b15;
    fdb_compact((fdb_file_handle *)auStack_1740._0_8_,"./dummy2");
    pfStack_1768 = (fdb_doc *)0x116b38;
    fdb_doc_create((fdb_doc **)pfVar19,(void *)psStack_1470[4],*psStack_1470,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_1768 = (fdb_doc *)0x116b45;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_1750._8_8_,(fdb_doc *)auStack_1750._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116cac;
    pfVar19 = (fdb_doc *)auStack_1750._0_8_;
    if (*(bool *)(auStack_1750._0_8_ + 0x48) == false) {
      pfStack_1768 = (fdb_doc *)0x116b6a;
      read_doc_by_offset_test();
      pfVar19 = (fdb_doc *)auStack_1740._8_8_;
    }
    pbVar8 = (btree *)pfVar19->meta;
    pfVar27 = (fdb_doc *)psStack_1470[7];
    pfStack_1768 = (fdb_doc *)0x116b8c;
    iVar4 = bcmp(pbVar8,pfVar27,pfVar19->metalen);
    if (iVar4 != 0) goto LAB_00116cb1;
    pfStack_1768 = (fdb_doc *)0x116ba1;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_1750._8_8_,pfVar19);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pfVar10 = (fdb_doc *)auStack_1750._0_8_;
      if (*(bool *)(auStack_1750._0_8_ + 0x48) == false) {
        pfStack_1768 = (fdb_doc *)0x116bc7;
        read_doc_by_offset_test();
        pfVar10 = (fdb_doc *)auStack_1740._8_8_;
      }
      pfStack_1768 = (fdb_doc *)0x116bcf;
      fdb_doc_free(pfVar10);
      auStack_1750._0_8_ = 0;
      lVar17 = 0;
      do {
        pfStack_1768 = (fdb_doc *)0x116be7;
        fdb_doc_free((fdb_doc *)(&afStack_1600[0].keylen)[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 100);
      pfStack_1768 = (fdb_doc *)0x116bfa;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1750._8_8_);
      pfStack_1768 = (fdb_doc *)0x116c04;
      fdb_close((fdb_file_handle *)auStack_1740._0_8_);
      pfStack_1768 = (fdb_doc *)0x116c09;
      fdb_shutdown();
      pfStack_1768 = (fdb_doc *)0x116c0e;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (read_doc_by_offset_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_1768 = (fdb_doc *)0x116c3f;
      fprintf(_stderr,pcVar23,"read_doc_by_offset test");
      return;
    }
  }
  else {
    pfStack_1768 = (fdb_doc *)0x116c56;
    read_doc_by_offset_test();
LAB_00116c56:
    pfStack_1768 = (fdb_doc *)0x116c5b;
    read_doc_by_offset_test();
LAB_00116c5b:
    pfStack_1768 = (fdb_doc *)0x116c60;
    read_doc_by_offset_test();
LAB_00116c60:
    pfStack_1768 = (fdb_doc *)0x116c6b;
    read_doc_by_offset_test();
LAB_00116c6b:
    pfStack_1768 = (fdb_doc *)0x116c70;
    read_doc_by_offset_test();
LAB_00116c70:
    pfStack_1768 = (fdb_doc *)0x116c7b;
    read_doc_by_offset_test();
LAB_00116c7b:
    pfStack_1768 = (fdb_doc *)0x116c86;
    read_doc_by_offset_test();
LAB_00116c86:
    pfVar27 = pfVar10;
    pfStack_1768 = (fdb_doc *)0x116c8b;
    read_doc_by_offset_test();
LAB_00116c8b:
    pfStack_1768 = (fdb_doc *)0x116c96;
    read_doc_by_offset_test();
LAB_00116c96:
    pfStack_1768 = (fdb_doc *)0x116ca1;
    read_doc_by_offset_test();
LAB_00116ca1:
    pfStack_1768 = (fdb_doc *)0x116cac;
    read_doc_by_offset_test();
LAB_00116cac:
    pfStack_1768 = (fdb_doc *)0x116cb1;
    read_doc_by_offset_test();
LAB_00116cb1:
    pfStack_1768 = (fdb_doc *)0x116cbc;
    read_doc_by_offset_test();
  }
  pfStack_1768 = (fdb_doc *)purge_logically_deleted_doc_test;
  read_doc_by_offset_test();
  pfStack_1c30 = (fdb_doc *)0x116ce1;
  pfStack_1790 = pfVar19;
  pfStack_1788 = (fdb_kvs_handle *)pcVar23;
  pfStack_1780 = (fdb_kvs_handle *)handle;
  pbStack_1778 = pbVar8;
  pfStack_1770 = pfVar27;
  pfStack_1768 = (fdb_doc *)pcVar20;
  gettimeofday(&tStack_1bb0,(__timezone_ptr_t)0x0);
  pfStack_1c30 = (fdb_doc *)0x116ce6;
  memleak_start();
  pfStack_1c20 = (fdb_doc *)0x0;
  pfStack_1c30 = (fdb_doc *)0x116cf7;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  pfStack_1c30 = (fdb_doc *)0x116d07;
  fdb_get_default_config();
  pfVar10 = afStack_1ba0;
  pfStack_1c30 = (fdb_doc *)0x116d17;
  fdb_get_default_kvs_config();
  fStack_1888.buffercache_size = 0;
  fStack_1888.wal_threshold = 0x400;
  fStack_1888.flags = 1;
  fStack_1888.purging_interval = 2;
  fStack_1888.compaction_threshold = '\0';
  ppfVar28 = &pfStack_1c10;
  pfStack_1c30 = (fdb_doc *)0x116d4c;
  fdb_open((fdb_file_handle **)ppfVar28,"./dummy1",&fStack_1888);
  pfVar11 = (fdb_kvs_handle *)&pfStack_1c18;
  pfStack_1c30 = (fdb_doc *)0x116d5f;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_1c10,(fdb_kvs_handle **)pfVar11,(fdb_kvs_config *)pfVar10);
  pfStack_1c30 = (fdb_doc *)0x116d75;
  fVar3 = fdb_set_log_callback(pfStack_1c18,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcVar23 = (char *)0x0;
    uVar26 = 0;
    do {
      pfStack_1c30 = (fdb_doc *)0x116d9d;
      sprintf(acStack_1988,"key%d",uVar26 & 0xffffffff);
      pfStack_1c30 = (fdb_doc *)0x116db5;
      sprintf((char *)afStack_1a88,"meta%d",uVar26 & 0xffffffff);
      pfStack_1c30 = (fdb_doc *)0x116dcd;
      sprintf((char *)&afStack_1ba0[0].size_ondisk,"body%d",uVar26 & 0xffffffff);
      ppfVar28 = (fdb_doc **)((long)apfStack_1c08 + (long)pcVar23);
      pfStack_1c30 = (fdb_doc *)0x116ddd;
      handle = (code *)strlen(acStack_1988);
      pcVar20 = (char *)afStack_1a88;
      pfStack_1c30 = (fdb_doc *)0x116df0;
      pfVar10 = (fdb_doc *)strlen(pcVar20);
      pfStack_1c30 = (fdb_doc *)0x116e00;
      sVar14 = strlen((char *)&afStack_1ba0[0].size_ondisk);
      pfStack_1c30 = (fdb_doc *)0x116e25;
      fdb_doc_create(ppfVar28,acStack_1988,(size_t)handle,pcVar20,(size_t)pfVar10,
                     &afStack_1ba0[0].size_ondisk,sVar14);
      pfStack_1c30 = (fdb_doc *)0x116e34;
      fdb_set(pfStack_1c18,apfStack_1c08[uVar26]);
      uVar26 = uVar26 + 1;
      pcVar23 = (char *)((long)pcVar23 + 8);
    } while (uVar26 != 10);
    keylen_00._0_1_ = *(uint8_t *)aStack_1be0;
    keylen_00._1_1_ = *(uint8_t *)((long)aStack_1be0 + 1);
    keylen_00._2_2_ = *(uint16_t *)((long)aStack_1be0 + 2);
    keylen_00._4_4_ = *(uint32_t *)((long)aStack_1be0 + 4);
    pfVar11 = (fdb_kvs_handle *)&pfStack_1c20;
    pfStack_1c30 = (fdb_doc *)0x116e71;
    fdb_doc_create((fdb_doc **)pfVar11,(btree_kv_ops *)(aStack_1be0.seqtrie)->aux,keylen_00,
                   (aStack_1be0.seqtrie)->btree_leaf_kv_ops,(aStack_1be0.seqtree)->root_bid,
                   (void *)0x0,0);
    pfStack_1c30 = (fdb_doc *)0x116e7e;
    fVar3 = fdb_del(pfStack_1c18,pfStack_1c20);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfVar11 = (fdb_kvs_handle *)&pfStack_1c20;
      pfStack_1c30 = (fdb_doc *)0x116e93;
      fdb_doc_free(pfStack_1c20);
      pfStack_1c20 = (fdb_doc *)0x0;
      pfStack_1c30 = (fdb_doc *)0x116ea9;
      fdb_commit((fdb_file_handle *)pfStack_1c10,'\0');
      pfStack_1c30 = (fdb_doc *)0x116eba;
      fdb_compact((fdb_file_handle *)pfStack_1c10,"./dummy2");
      pcVar20 = (char *)0x0;
      pfVar19 = pfVar10;
      do {
        pfStack_1c30 = (fdb_doc *)0x116ee0;
        fdb_doc_create((fdb_doc **)pfVar11,apfStack_1c08[(long)pcVar20]->key,
                       apfStack_1c08[(long)pcVar20]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1c30 = (fdb_doc *)0x116eef;
        fVar3 = fdb_get(pfStack_1c18,pfStack_1c20);
        pfVar10 = pfStack_1c20;
        if ((fdb_doc *)pcVar20 != (fdb_doc *)0x5) {
          if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001171a3:
            pfStack_1c30 = (fdb_doc *)0x1171a8;
            purge_logically_deleted_doc_test();
            goto LAB_001171a8;
          }
          ppfVar28 = (fdb_doc **)pfStack_1c20->meta;
          pfVar13 = (fdb_kvs_handle *)apfStack_1c08[(long)pcVar20];
          pcVar23 = (char *)pfVar13->staletree;
          pfStack_1c30 = (fdb_doc *)0x116f31;
          iVar4 = bcmp(ppfVar28,pcVar23,pfStack_1c20->metalen);
          handle = (code *)pfVar11;
          if (iVar4 == 0) {
            ppfVar28 = (fdb_doc **)pfVar10->body;
            pcVar23 = (char *)(pfVar13->field_6).seqtree;
            pfStack_1c30 = (fdb_doc *)0x116f50;
            iVar4 = bcmp(ppfVar28,pcVar23,pfVar10->bodylen);
            if (iVar4 == 0) goto LAB_00116f61;
LAB_00117198:
            pfStack_1c30 = (fdb_doc *)0x1171a3;
            purge_logically_deleted_doc_test();
            pfVar19 = pfVar10;
            goto LAB_001171a3;
          }
LAB_001171ad:
          pfStack_1c30 = (fdb_doc *)0x1171b8;
          purge_logically_deleted_doc_test();
          goto LAB_001171b8;
        }
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_001171a8:
          pfVar10 = pfVar19;
          pfStack_1c30 = (fdb_doc *)0x1171ad;
          purge_logically_deleted_doc_test();
          pfVar13 = pfVar11;
          handle = (code *)(fdb_kvs_handle *)0x0;
          goto LAB_001171ad;
        }
LAB_00116f61:
        handle = (code *)0x0;
        pfStack_1c30 = (fdb_doc *)0x116f69;
        fdb_doc_free(pfVar10);
        pfStack_1c20 = (fdb_doc *)0x0;
        pfStack_1c30 = (fdb_doc *)0x116f8e;
        fdb_doc_create((fdb_doc **)pfVar11,apfStack_1c08[(long)pcVar20]->key,
                       apfStack_1c08[(long)pcVar20]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1c30 = (fdb_doc *)0x116f9d;
        fVar3 = fdb_get_metaonly(pfStack_1c18,pfStack_1c20);
        if ((fdb_doc *)pcVar20 == (fdb_doc *)0x5) {
          if ((fVar3 != FDB_RESULT_KEY_NOT_FOUND) && (fVar3 != FDB_RESULT_SUCCESS))
          goto LAB_001171e2;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_1c30 = (fdb_doc *)0x117198;
          purge_logically_deleted_doc_test();
          goto LAB_00117198;
        }
        pfStack_1c30 = (fdb_doc *)0x116fc3;
        fdb_doc_free(pfStack_1c20);
        pfStack_1c20 = (fdb_doc *)0x0;
        pcVar20 = (char *)((long)&((fdb_doc *)pcVar20)->keylen + 1);
        pfVar19 = pfVar10;
      } while ((fdb_doc *)pcVar20 != (fdb_doc *)0xa);
      pfStack_1c30 = (fdb_doc *)0x116fe5;
      puts("wait for 3 seconds..");
      pfStack_1c30 = (fdb_doc *)0x116fef;
      sleep(3);
      pfStack_1c30 = (fdb_doc *)0x117000;
      fdb_compact((fdb_file_handle *)pfStack_1c10,"./dummy3");
      pfVar13 = (fdb_kvs_handle *)&pfStack_1c20;
      pcVar20 = (char *)0x0;
      do {
        handle = (code *)0x0;
        pfStack_1c30 = (fdb_doc *)0x11702e;
        fdb_doc_create((fdb_doc **)pfVar13,apfStack_1c08[(long)pcVar20]->key,
                       apfStack_1c08[(long)pcVar20]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1c30 = (fdb_doc *)0x11703d;
        fVar3 = fdb_get(pfStack_1c18,pfStack_1c20);
        pfVar19 = pfStack_1c20;
        if ((fdb_doc *)pcVar20 == (fdb_doc *)0x5) {
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171bd;
        }
        else {
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001171b8;
          ppfVar28 = (fdb_doc **)pfStack_1c20->meta;
          handle = (code *)apfStack_1c08[(long)pcVar20];
          pcVar23 = (char *)((fdb_kvs_handle *)handle)->staletree;
          pfStack_1c30 = (fdb_doc *)0x11707c;
          iVar4 = bcmp(ppfVar28,pcVar23,pfStack_1c20->metalen);
          if (iVar4 != 0) goto LAB_001171c7;
          ppfVar28 = (fdb_doc **)pfVar19->body;
          pcVar23 = (char *)(((fdb_kvs_handle *)handle)->field_6).seqtree;
          pfStack_1c30 = (fdb_doc *)0x11709b;
          iVar4 = bcmp(ppfVar28,pcVar23,pfVar19->bodylen);
          handle = (code *)0x0;
          if (iVar4 != 0) goto LAB_001171d7;
        }
        handle = (code *)0x0;
        pfStack_1c30 = (fdb_doc *)0x1170b1;
        fdb_doc_free(pfVar19);
        pfStack_1c20 = (fdb_doc *)0x0;
        pfStack_1c30 = (fdb_doc *)0x1170d6;
        fdb_doc_create((fdb_doc **)pfVar13,apfStack_1c08[(long)pcVar20]->key,
                       apfStack_1c08[(long)pcVar20]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1c30 = (fdb_doc *)0x1170e5;
        fVar3 = fdb_get_metaonly(pfStack_1c18,pfStack_1c20);
        if ((fdb_doc *)pcVar20 == (fdb_doc *)0x5) {
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171c2;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001171d2;
        pfStack_1c30 = (fdb_doc *)0x117107;
        fdb_doc_free(pfStack_1c20);
        pfStack_1c20 = (fdb_doc *)0x0;
        pcVar20 = (char *)((long)&((fdb_doc *)pcVar20)->keylen + 1);
        pfVar10 = pfVar19;
        if ((fdb_doc *)pcVar20 == (fdb_doc *)0xa) {
          pfStack_1c30 = (fdb_doc *)0x117127;
          fdb_kvs_close(pfStack_1c18);
          pfStack_1c30 = (fdb_doc *)0x117131;
          fdb_close((fdb_file_handle *)pfStack_1c10);
          lVar17 = 0;
          do {
            pfStack_1c30 = (fdb_doc *)0x11713d;
            fdb_doc_free(apfStack_1c08[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 10);
          pfStack_1c30 = (fdb_doc *)0x11714b;
          fdb_shutdown();
          pfStack_1c30 = (fdb_doc *)0x117150;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_1c30 = (fdb_doc *)0x117181;
          fprintf(_stderr,pcVar23,"purge logically deleted doc test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001171e7:
    pfStack_1c30 = (fdb_doc *)0x1171ec;
    purge_logically_deleted_doc_test();
  }
  pfStack_1c30 = (fdb_doc *)api_wrapper_test;
  purge_logically_deleted_doc_test();
  pfStack_20b8 = (fdb_doc *)0x11720e;
  pfStack_1c58 = pfVar11;
  pfStack_1c50 = (fdb_kvs_handle *)pcVar23;
  pfStack_1c48 = (fdb_kvs_handle *)handle;
  pfStack_1c40 = pfVar10;
  ppfStack_1c38 = ppfVar28;
  pfStack_1c30 = (fdb_doc *)pcVar20;
  gettimeofday((timeval *)(auStack_2098 + 0x10),(__timezone_ptr_t)0x0);
  pfStack_20b8 = (fdb_doc *)0x117213;
  memleak_start();
  pfStack_20b8 = (fdb_doc *)0x11721f;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_20b8 = (fdb_doc *)0x11722f;
  fdb_get_default_config();
  pfVar13 = (fdb_kvs_handle *)auStack_2078;
  pfStack_20b8 = (fdb_doc *)0x11723c;
  fdb_get_default_kvs_config();
  afStack_1e58[0].buffercache_size = 0;
  afStack_1e58[0].wal_threshold = 0x400;
  afStack_1e58[0].flags = 1;
  afStack_1e58[0].purging_interval = 0;
  afStack_1e58[0].compaction_threshold = '\0';
  pcVar25 = auStack_2098 + 8;
  pfStack_20b8 = (fdb_doc *)0x117275;
  fdb_open((fdb_file_handle **)pcVar25,"./dummy1",afStack_1e58);
  pfVar11 = (fdb_kvs_handle *)&pfStack_20a8;
  pfStack_20b8 = (fdb_doc *)0x117288;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2098._8_8_,(fdb_kvs_handle **)pfVar11,
             (fdb_kvs_config *)pfVar13);
  pfStack_20b8 = (fdb_doc *)0x11729e;
  fVar3 = fdb_set_log_callback(pfStack_20a8,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_20b8 = (fdb_doc *)0x1172b9;
    fVar3 = fdb_set_kv(pfStack_20a8,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011750b;
    __s = auStack_2078 + 0x18;
    pcVar25 = "body%d";
    pcVar23 = (char *)(afStack_1e58 + 1);
    pcVar20 = (char *)0x0;
    do {
      pfStack_20b8 = (fdb_doc *)0x1172eb;
      sprintf(__s,"key%d",pcVar20);
      pfStack_20b8 = (fdb_doc *)0x1172fa;
      sprintf(pcVar23,"body%d",pcVar20);
      handle = (code *)pfStack_20a8;
      pfStack_20b8 = (fdb_doc *)0x117307;
      pfVar11 = (fdb_kvs_handle *)strlen(__s);
      pfStack_20b8 = (fdb_doc *)0x117312;
      sVar14 = strlen(pcVar23);
      pfStack_20b8 = (fdb_doc *)0x117326;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle,__s,(size_t)pfVar11,pcVar23,sVar14);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_20b8 = (fdb_doc *)0x1174ec;
        api_wrapper_test();
        goto LAB_001174ec;
      }
      uVar24 = (int)pcVar20 + 1;
      pcVar20 = (char *)(ulong)uVar24;
    } while (uVar24 != 10);
    pfVar11 = (fdb_kvs_handle *)(auStack_2078 + 0x18);
    pfStack_20b8 = (fdb_doc *)0x117350;
    sprintf((char *)pfVar11,"key%d",5);
    pfVar13 = pfStack_20a8;
    pfStack_20b8 = (fdb_doc *)0x11735d;
    sVar14 = strlen((char *)pfVar11);
    pfStack_20b8 = (fdb_doc *)0x11736b;
    fVar3 = fdb_del_kv(pfVar13,pfVar11,sVar14);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117510;
    pfStack_20b8 = (fdb_doc *)0x117381;
    fVar3 = fdb_del_kv(pfStack_20a8,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00117515;
    pfVar13 = (fdb_kvs_handle *)(auStack_2078 + 0x18);
    pcVar25 = (char *)&pfStack_20a0;
    pcVar23 = auStack_2098;
    pcVar20 = (char *)afStack_1f60;
    handle = (code *)0x0;
    do {
      pfStack_20b8 = (fdb_doc *)0x1173b8;
      sprintf((char *)pfVar13,"key%d",handle);
      pfVar11 = pfStack_20a8;
      pfStack_20b8 = (fdb_doc *)0x1173c5;
      sVar14 = strlen((char *)pfVar13);
      pfStack_20b8 = (fdb_doc *)0x1173d9;
      fVar3 = fdb_get_kv(pfVar11,pfVar13,sVar14,(void **)pcVar25,(size_t *)pcVar23);
      if ((int)handle == 5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00117501;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001174fc;
        pfStack_20b8 = (fdb_doc *)0x117405;
        sprintf(pcVar20,"body%d",handle);
        pfVar11 = pfStack_20a0;
        pfStack_20b8 = (fdb_doc *)0x11741a;
        iVar4 = bcmp(pfStack_20a0,pcVar20,auStack_2098._0_8_);
        if (iVar4 != 0) goto LAB_001174ec;
        pfStack_20b8 = (fdb_doc *)0x11742a;
        fdb_free_block(pfVar11);
      }
      uVar24 = (int)handle + 1;
      handle = (code *)(ulong)uVar24;
    } while (uVar24 != 10);
    pfStack_20b8 = (fdb_doc *)0x11744f;
    fVar3 = fdb_get_kv(pfStack_20a8,(void *)0x0,0,&pfStack_20a0,(size_t *)auStack_2098);
    pfVar16 = pfStack_20a8;
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011751a;
    pfVar13 = (fdb_kvs_handle *)(auStack_2078 + 0x18);
    pfStack_20b8 = (fdb_doc *)0x11746a;
    sVar14 = strlen((char *)pfVar13);
    pfStack_20b8 = (fdb_doc *)0x11747d;
    fVar3 = fdb_get_kv(pfVar16,pfVar13,sVar14,(void **)0x0,(size_t *)0x0);
    if (fVar3 == FDB_RESULT_INVALID_ARGS) {
      pfStack_20b8 = (fdb_doc *)0x117490;
      fdb_kvs_close(pfStack_20a8);
      pfStack_20b8 = (fdb_doc *)0x11749a;
      fdb_close((fdb_file_handle *)auStack_2098._8_8_);
      pfStack_20b8 = (fdb_doc *)0x11749f;
      fdb_shutdown();
      pfStack_20b8 = (fdb_doc *)0x1174a4;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_20b8 = (fdb_doc *)0x1174d5;
      fprintf(_stderr,pcVar23,"API wrapper test");
      return;
    }
  }
  else {
LAB_00117506:
    pfStack_20b8 = (fdb_doc *)0x11750b;
    api_wrapper_test();
LAB_0011750b:
    pfStack_20b8 = (fdb_doc *)0x117510;
    api_wrapper_test();
LAB_00117510:
    pfStack_20b8 = (fdb_doc *)0x117515;
    api_wrapper_test();
LAB_00117515:
    pfStack_20b8 = (fdb_doc *)0x11751a;
    api_wrapper_test();
LAB_0011751a:
    pfVar16 = pfVar11;
    pfStack_20b8 = (fdb_doc *)0x11751f;
    api_wrapper_test();
  }
  pfStack_20b8 = (fdb_doc *)flush_before_commit_test;
  api_wrapper_test();
  pfStack_2640 = (fdb_doc *)0x117544;
  pfStack_20e0 = pfVar16;
  pfStack_20d8 = (fdb_kvs_handle *)pcVar23;
  pfStack_20d0 = (fdb_kvs_handle *)handle;
  pfStack_20c8 = pfVar13;
  ppfStack_20c0 = (fdb_kvs_handle **)pcVar25;
  pfStack_20b8 = (fdb_doc *)pcVar20;
  gettimeofday(&tStack_2510,(__timezone_ptr_t)0x0);
  pfStack_2640 = (fdb_doc *)0x117549;
  memleak_start();
  pfStack_2640 = (fdb_doc *)0x117555;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2640 = (fdb_doc *)0x117565;
  fdb_get_default_config();
  pfStack_2640 = (fdb_doc *)0x117575;
  fdb_get_default_kvs_config();
  fStack_23e0.buffercache_size = 0;
  fStack_23e0.wal_threshold = 5;
  fStack_23e0.flags = 1;
  fStack_23e0.purging_interval = 0;
  fStack_23e0.compaction_threshold = '\0';
  fStack_23e0.wal_flush_before_commit = true;
  pfStack_2640 = (fdb_doc *)0x1175b9;
  fdb_open(&pfStack_2610,"dummy1",&fStack_23e0);
  pfStack_2640 = (fdb_doc *)0x1175cc;
  fdb_open(&pfStack_2628,"dummy1",&fStack_23e0);
  pfStack_2640 = (fdb_doc *)0x1175dd;
  fdb_kvs_open_default(pfStack_2610,&pfStack_2618,&fStack_2500);
  pfStack_2640 = (fdb_doc *)0x1175f1;
  fdb_kvs_open_default(pfStack_2628,&pfStack_2620,&fStack_2500);
  pfStack_2640 = (fdb_doc *)0x117607;
  fVar3 = fdb_set_log_callback(pfStack_2620,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar28 = apfStack_2608;
    uVar26 = 0;
    do {
      pfStack_2640 = (fdb_doc *)0x117633;
      sprintf(acStack_24e8,"key%d",uVar26 & 0xffffffff);
      pfStack_2640 = (fdb_doc *)0x11764f;
      sprintf(acStack_21e8,"meta%d",uVar26 & 0xffffffff);
      pfStack_2640 = (fdb_doc *)0x11766b;
      sprintf(acStack_22e8,"body%d",uVar26 & 0xffffffff);
      pfStack_2640 = (fdb_doc *)0x117673;
      sVar14 = strlen(acStack_24e8);
      pfStack_2640 = (fdb_doc *)0x11767e;
      sVar5 = strlen(acStack_21e8);
      pfStack_2640 = (fdb_doc *)0x117689;
      sVar9 = strlen(acStack_22e8);
      pfStack_2640 = (fdb_doc *)0x1176a9;
      fdb_doc_create(ppfVar28,acStack_24e8,sVar14,acStack_21e8,sVar5,acStack_22e8,sVar9);
      uVar26 = uVar26 + 1;
      ppfVar28 = ppfVar28 + 1;
    } while (uVar26 != 0x1e);
    pfStack_2640 = (fdb_doc *)0x1176c9;
    fdb_begin_transaction(pfStack_2628,'\x02');
    pfStack_2640 = (fdb_doc *)0x1176d8;
    fdb_set(pfStack_2618,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x1176e7;
    fdb_set(pfStack_2618,apfStack_2608[1]);
    lVar17 = 0;
    pfStack_2640 = (fdb_doc *)0x1176f5;
    fdb_commit(pfStack_2610,'\0');
    pfStack_2640 = (fdb_doc *)0x117704;
    fdb_set(pfStack_2620,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x117713;
    fdb_set(pfStack_2620,apfStack_2608[1]);
    pfStack_2640 = (fdb_doc *)0x11771f;
    fdb_end_transaction(pfStack_2628,'\0');
    pfStack_2640 = (fdb_doc *)0x11772e;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2640 = (fdb_doc *)0x11773d;
    fdb_begin_transaction(pfStack_2628,'\x02');
    pfStack_2640 = (fdb_doc *)0x11774c;
    fdb_set(pfStack_2620,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x11775b;
    fdb_set(pfStack_2620,apfStack_2608[1]);
    pfStack_2640 = (fdb_doc *)0x117767;
    fdb_end_transaction(pfStack_2628,'\0');
    pfStack_2640 = (fdb_doc *)0x117776;
    fdb_set(pfStack_2618,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x117785;
    fdb_set(pfStack_2618,apfStack_2608[1]);
    pfStack_2640 = (fdb_doc *)0x117791;
    fdb_commit(pfStack_2610,'\0');
    pfStack_2640 = (fdb_doc *)0x1177a0;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2640 = (fdb_doc *)0x1177af;
    fdb_begin_transaction(pfStack_2628,'\x02');
    pfStack_2640 = (fdb_doc *)0x1177be;
    fdb_set(pfStack_2620,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x1177cd;
    fdb_set(pfStack_2620,apfStack_2608[1]);
    pfStack_2640 = (fdb_doc *)0x1177dc;
    fdb_set(pfStack_2618,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x1177eb;
    fdb_set(pfStack_2618,apfStack_2608[1]);
    pfStack_2640 = (fdb_doc *)0x1177f7;
    fdb_commit(pfStack_2610,'\0');
    pfStack_2640 = (fdb_doc *)0x117803;
    fdb_end_transaction(pfStack_2628,'\0');
    pfStack_2640 = (fdb_doc *)0x117812;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2640 = (fdb_doc *)0x117821;
    fdb_begin_transaction(pfStack_2628,'\x02');
    pfStack_2640 = (fdb_doc *)0x117830;
    fdb_set(pfStack_2618,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x11783f;
    fdb_set(pfStack_2618,apfStack_2608[1]);
    pfStack_2640 = (fdb_doc *)0x11784e;
    fdb_set(pfStack_2620,apfStack_2608[0]);
    pfStack_2640 = (fdb_doc *)0x11785d;
    fdb_set(pfStack_2620,apfStack_2608[1]);
    pfStack_2640 = (fdb_doc *)0x117869;
    fdb_end_transaction(pfStack_2628,'\0');
    pfStack_2640 = (fdb_doc *)0x117875;
    fdb_commit(pfStack_2610,'\0');
    pfStack_2640 = (fdb_doc *)0x117884;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2640 = (fdb_doc *)0x117893;
    fdb_begin_transaction(pfStack_2628,'\x02');
    do {
      pfStack_2640 = (fdb_doc *)0x1178a2;
      fdb_set(pfStack_2620,apfStack_2608[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 10);
    lVar17 = 0;
    do {
      pfStack_2640 = (fdb_doc *)0x1178bf;
      fdb_set(pfStack_2618,apfStack_2608[lVar17 + 10]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 10);
    pfStack_2640 = (fdb_doc *)0x1178d9;
    fdb_compact(pfStack_2610,"dummy2");
    lVar17 = 0;
    do {
      pfStack_2640 = (fdb_doc *)0x1178ed;
      fdb_set(pfStack_2620,apfStack_2608[lVar17 + 0x14]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 5);
    lVar17 = 0;
    pfStack_2640 = (fdb_doc *)0x117904;
    fdb_end_transaction(pfStack_2628,'\0');
    do {
      pfStack_2640 = (fdb_doc *)0x117916;
      fdb_set(pfStack_2618,apfStack_2608[lVar17 + 0x19]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 5);
    pfStack_2640 = (fdb_doc *)0x117929;
    fdb_close(pfStack_2610);
    pfStack_2640 = (fdb_doc *)0x117933;
    fdb_close(pfStack_2628);
    lVar17 = 0;
    do {
      pfStack_2640 = (fdb_doc *)0x11793f;
      fdb_doc_free(apfStack_2608[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x1e);
    pfStack_2640 = (fdb_doc *)0x11794d;
    fdb_shutdown();
    pfStack_2640 = (fdb_doc *)0x117952;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_2640 = (fdb_doc *)0x117983;
    fprintf(_stderr,pcVar23,"flush before commit test");
    return;
  }
  pfStack_2640 = (fdb_doc *)flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_2648 = "dummy1";
  pfStack_2b18 = (fdb_encryption_key *)0x1179bd;
  pfStack_2668 = &fStack_2500;
  ppfStack_2660 = &pfStack_2610;
  ppfStack_2658 = &pfStack_2628;
  ppfStack_2650 = &pfStack_2620;
  pfStack_2640 = (fdb_doc *)pcVar20;
  gettimeofday(&tStack_2a70,(__timezone_ptr_t)0x0);
  pfStack_2b18 = (fdb_encryption_key *)0x1179c2;
  memleak_start();
  pfStack_2b08 = (fdb_doc *)0x0;
  pfStack_2b18 = (fdb_encryption_key *)0x1179d3;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2b18 = (fdb_encryption_key *)0x1179e3;
  fdb_get_default_config();
  fStack_2760.buffercache_size = 0;
  fStack_2760.wal_threshold = 8;
  fStack_2760.flags = 1;
  fStack_2760.purging_interval = 0;
  fStack_2760.compaction_threshold = '\0';
  fStack_2760.wal_flush_before_commit = true;
  pfStack_2b18 = (fdb_encryption_key *)0x117a15;
  fdb_get_default_kvs_config();
  pfStack_2b18 = (fdb_encryption_key *)0x117a2c;
  fdb_open(&pfStack_2af0,"dummy1",&fStack_2760);
  pfStack_2b18 = (fdb_encryption_key *)0x117a3e;
  fdb_kvs_open(pfStack_2af0,&pfStack_2b00,(char *)0x0,&fStack_2a88);
  lVar17 = 0;
  uVar26 = 0;
  do {
    ppfVar12 = &fStack_2a60.bub_ctx.handle;
    pfStack_2b18 = (fdb_encryption_key *)0x117a5e;
    sprintf((char *)ppfVar12,"key%d",uVar26 & 0xffffffff);
    pfStack_2b18 = (fdb_encryption_key *)0x117a76;
    sprintf((char *)&fStack_2a60.config.encryption_key,"meta%d",uVar26 & 0xffffffff);
    pfStack_2b18 = (fdb_encryption_key *)0x117a8e;
    sprintf((char *)&fStack_2a60,"body%d",uVar26 & 0xffffffff);
    pfStack_2b18 = (fdb_encryption_key *)0x117a9e;
    sVar14 = strlen((char *)ppfVar12);
    pfVar21 = &fStack_2a60.config.encryption_key;
    pfStack_2b18 = (fdb_encryption_key *)0x117ab1;
    sVar5 = strlen((char *)pfVar21);
    pfStack_2b18 = (fdb_encryption_key *)0x117ac1;
    sVar9 = strlen((char *)&fStack_2a60);
    pfStack_2b18 = (fdb_encryption_key *)0x117ae6;
    fdb_doc_create((fdb_doc **)((long)apfStack_2ae0 + lVar17),&fStack_2a60.bub_ctx.handle,sVar14,
                   pfVar21,sVar5,&fStack_2a60,sVar9);
    pfStack_2b18 = (fdb_encryption_key *)0x117af5;
    fdb_set(pfStack_2b00,apfStack_2ae0[uVar26]);
    uVar26 = uVar26 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar26 != 10);
  pfStack_2b18 = (fdb_encryption_key *)0x117b15;
  fdb_commit(pfStack_2af0,'\x01');
  pfStack_2b18 = (fdb_encryption_key *)0x117b31;
  fdb_open(&pfStack_2ae8,"dummy1",&fStack_2760);
  pfStack_2b18 = (fdb_encryption_key *)0x117b48;
  fdb_kvs_open(pfStack_2ae8,&pfStack_2af8,(char *)0x0,&fStack_2a88);
  pfVar21 = &fStack_2a60.config.encryption_key;
  lVar17 = 0;
  uVar26 = 0;
  do {
    pfStack_2b18 = (fdb_encryption_key *)0x117b71;
    sprintf((char *)pfVar21,"meta2%d",uVar26 & 0xffffffff);
    pfStack_2b18 = (fdb_encryption_key *)0x117b85;
    sprintf((char *)&fStack_2a60,"body2%d(db2)",uVar26 & 0xffffffff);
    pfStack_2b18 = (fdb_encryption_key *)0x117b95;
    sVar14 = strlen((char *)pfVar21);
    pfStack_2b18 = (fdb_encryption_key *)0x117ba0;
    sVar5 = strlen((char *)&fStack_2a60);
    pfStack_2b18 = (fdb_encryption_key *)0x117bb4;
    fdb_doc_update((fdb_doc **)((long)apfStack_2ae0 + lVar17),pfVar21,sVar14,&fStack_2a60,sVar5);
    pfStack_2b18 = (fdb_encryption_key *)0x117bc3;
    fdb_set(pfStack_2af8,apfStack_2ae0[uVar26]);
    uVar26 = uVar26 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar26 != 5);
  uVar26 = 5;
  lVar17 = 0x28;
  pfVar21 = &fStack_2a60.config.encryption_key;
  pfVar11 = &fStack_2a60;
  do {
    pfStack_2b18 = (fdb_encryption_key *)0x117c05;
    sprintf((char *)pfVar21,"meta2%d",uVar26 & 0xffffffff);
    pfStack_2b18 = (fdb_encryption_key *)0x117c14;
    sprintf((char *)pfVar11,"body2%d(db1)",uVar26 & 0xffffffff);
    pfStack_2b18 = (fdb_encryption_key *)0x117c24;
    sVar14 = strlen((char *)pfVar21);
    pfStack_2b18 = (fdb_encryption_key *)0x117c2f;
    sVar5 = strlen((char *)pfVar11);
    pfStack_2b18 = (fdb_encryption_key *)0x117c4a;
    fdb_doc_update((fdb_doc **)((long)apfStack_2ae0 + lVar17),pfVar21,sVar14,pfVar11,sVar5);
    pfStack_2b18 = (fdb_encryption_key *)0x117c59;
    fdb_set(pfStack_2b00,apfStack_2ae0[uVar26]);
    uVar26 = uVar26 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar26 != 10);
  ppfVar12 = &fStack_2a60.bub_ctx.handle;
  pfVar21 = &fStack_2a60.config.encryption_key;
  uVar26 = 0;
  do {
    pcVar23 = "body2%d(db1)";
    pfStack_2b18 = (fdb_encryption_key *)0x117c93;
    sprintf((char *)ppfVar12,"key%d",uVar26);
    pfStack_2b18 = (fdb_encryption_key *)0x117ca6;
    sprintf((char *)pfVar21,"meta2%d",uVar26);
    if ((uint)uVar26 < 5) {
      pcVar23 = "body2%d(db2)";
    }
    pfStack_2b18 = (fdb_encryption_key *)0x117cc3;
    sprintf((char *)&fStack_2a60,pcVar23,uVar26);
    pfStack_2b18 = (fdb_encryption_key *)0x117ccb;
    sVar14 = strlen((char *)ppfVar12);
    pfStack_2b18 = (fdb_encryption_key *)0x117ceb;
    fdb_doc_create(&pfStack_2b08,ppfVar12,sVar14,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b18 = (fdb_encryption_key *)0x117cfa;
    fVar3 = fdb_get(pfStack_2b00,pfStack_2b08);
    pfVar10 = pfStack_2b08;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00118008:
      pfStack_2b18 = (fdb_encryption_key *)0x11800d;
      flush_before_commit_multi_writers_test();
LAB_0011800d:
      pfStack_2b18 = (fdb_encryption_key *)0x118012;
      flush_before_commit_multi_writers_test();
      pfVar10 = (fdb_doc *)pcVar23;
LAB_00118012:
      pfStack_2b18 = (fdb_encryption_key *)0x118022;
      flush_before_commit_multi_writers_test();
LAB_00118022:
      pfStack_2b18 = (fdb_encryption_key *)0x118032;
      flush_before_commit_multi_writers_test();
LAB_00118032:
      pfStack_2b18 = (fdb_encryption_key *)0x118042;
      flush_before_commit_multi_writers_test();
      goto LAB_00118042;
    }
    pfVar11 = (fdb_kvs_handle *)pfStack_2b08->meta;
    pfStack_2b18 = (fdb_encryption_key *)0x117d1a;
    iVar4 = bcmp(pfVar21,pfVar11,pfStack_2b08->metalen);
    if (iVar4 != 0) {
      pfStack_2b18 = (fdb_encryption_key *)0x118008;
      flush_before_commit_multi_writers_test();
      pcVar23 = (char *)pfVar10;
      goto LAB_00118008;
    }
    pfVar11 = (fdb_kvs_handle *)pfVar10->body;
    pfStack_2b18 = (fdb_encryption_key *)0x117d35;
    iVar4 = bcmp(&fStack_2a60,pfVar11,pfVar10->bodylen);
    if (iVar4 != 0) goto LAB_00118012;
    pfStack_2b18 = (fdb_encryption_key *)0x117d45;
    fdb_doc_free(pfVar10);
    pcVar23 = (char *)0x0;
    pfStack_2b08 = (fdb_doc *)0x0;
    pfStack_2b18 = (fdb_encryption_key *)0x117d55;
    sVar14 = strlen((char *)ppfVar12);
    pfStack_2b18 = (fdb_encryption_key *)0x117d71;
    fdb_doc_create(&pfStack_2b08,ppfVar12,sVar14,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b18 = (fdb_encryption_key *)0x117d80;
    fVar3 = fdb_get(pfStack_2af8,pfStack_2b08);
    pfVar10 = pfStack_2b08;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011800d;
    pfVar11 = (fdb_kvs_handle *)pfStack_2b08->meta;
    pfStack_2b18 = (fdb_encryption_key *)0x117da0;
    iVar4 = bcmp(pfVar21,pfVar11,pfStack_2b08->metalen);
    if (iVar4 != 0) goto LAB_00118032;
    pfVar11 = (fdb_kvs_handle *)pfVar10->body;
    pfStack_2b18 = (fdb_encryption_key *)0x117dbb;
    iVar4 = bcmp(&fStack_2a60,pfVar11,pfVar10->bodylen);
    if (iVar4 != 0) goto LAB_00118022;
    pfStack_2b18 = (fdb_encryption_key *)0x117dcb;
    fdb_doc_free(pfVar10);
    pfStack_2b08 = (fdb_doc *)0x0;
    uVar24 = (uint)uVar26 + 1;
    uVar26 = (ulong)uVar24;
  } while (uVar24 != 10);
  pfStack_2b18 = (fdb_encryption_key *)0x117df2;
  fdb_commit(pfStack_2af0,'\0');
  pfStack_2b18 = (fdb_encryption_key *)0x117dfe;
  fdb_commit(pfStack_2ae8,'\0');
  ppfVar12 = &fStack_2a60.bub_ctx.handle;
  pfVar21 = &fStack_2a60.config.encryption_key;
  uVar26 = 0;
  while( true ) {
    pfStack_2b18 = (fdb_encryption_key *)0x117e32;
    sprintf((char *)ppfVar12,"key%d",uVar26);
    pfStack_2b18 = (fdb_encryption_key *)0x117e45;
    sprintf((char *)pfVar21,"meta2%d",uVar26);
    pcVar23 = "body2%d(db1)";
    if ((uint)uVar26 < 5) {
      pcVar23 = "body2%d(db2)";
    }
    pfStack_2b18 = (fdb_encryption_key *)0x117e5f;
    sprintf((char *)&fStack_2a60,pcVar23,uVar26);
    pfStack_2b18 = (fdb_encryption_key *)0x117e67;
    sVar14 = strlen((char *)ppfVar12);
    pfStack_2b18 = (fdb_encryption_key *)0x117e87;
    fdb_doc_create(&pfStack_2b08,ppfVar12,sVar14,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b18 = (fdb_encryption_key *)0x117e96;
    fVar3 = fdb_get(pfStack_2b00,pfStack_2b08);
    pfVar10 = pfStack_2b08;
    pfVar19 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar11 = (fdb_kvs_handle *)pfStack_2b08->meta;
    pfStack_2b18 = (fdb_encryption_key *)0x117eb6;
    iVar4 = bcmp(pfVar21,pfVar11,pfStack_2b08->metalen);
    if (iVar4 != 0) goto LAB_00118042;
    pfVar11 = (fdb_kvs_handle *)pfVar10->body;
    pfStack_2b18 = (fdb_encryption_key *)0x117ed1;
    iVar4 = bcmp(&fStack_2a60,pfVar11,pfVar10->bodylen);
    if (iVar4 != 0) goto LAB_0011805c;
    pfStack_2b18 = (fdb_encryption_key *)0x117ee1;
    fdb_doc_free(pfVar10);
    pfVar19 = (fdb_doc *)0x0;
    pfStack_2b08 = (fdb_doc *)0x0;
    pfStack_2b18 = (fdb_encryption_key *)0x117ef1;
    sVar14 = strlen((char *)ppfVar12);
    pfStack_2b18 = (fdb_encryption_key *)0x117f0d;
    fdb_doc_create(&pfStack_2b08,ppfVar12,sVar14,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b18 = (fdb_encryption_key *)0x117f1c;
    fVar3 = fdb_get(pfStack_2af8,pfStack_2b08);
    pfVar10 = pfStack_2b08;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118057;
    pfVar11 = (fdb_kvs_handle *)pfStack_2b08->meta;
    pfStack_2b18 = (fdb_encryption_key *)0x117f3c;
    iVar4 = bcmp(pfVar21,pfVar11,pfStack_2b08->metalen);
    if (iVar4 != 0) goto LAB_0011807c;
    pfVar11 = (fdb_kvs_handle *)pfVar10->body;
    pfStack_2b18 = (fdb_encryption_key *)0x117f57;
    iVar4 = bcmp(&fStack_2a60,pfVar11,pfVar10->bodylen);
    if (iVar4 != 0) goto LAB_0011806c;
    pfStack_2b18 = (fdb_encryption_key *)0x117f67;
    fdb_doc_free(pfVar10);
    pfStack_2b08 = (fdb_doc *)0x0;
    uVar24 = (uint)uVar26 + 1;
    uVar26 = (ulong)uVar24;
    if (uVar24 == 10) {
      pfStack_2b18 = (fdb_encryption_key *)0x117f8c;
      fdb_close(pfStack_2af0);
      pfStack_2b18 = (fdb_encryption_key *)0x117f96;
      fdb_close(pfStack_2ae8);
      lVar17 = 0;
      do {
        pfStack_2b18 = (fdb_encryption_key *)0x117fa2;
        fdb_doc_free(apfStack_2ae0[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      pfStack_2b18 = (fdb_encryption_key *)0x117fb0;
      fdb_shutdown();
      pfStack_2b18 = (fdb_encryption_key *)0x117fb5;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_2b18 = (fdb_encryption_key *)0x117fe6;
      fprintf(_stderr,pcVar23,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00118052:
  pfStack_2b18 = (fdb_encryption_key *)0x118057;
  flush_before_commit_multi_writers_test();
LAB_00118057:
  pfStack_2b18 = (fdb_encryption_key *)0x11805c;
  flush_before_commit_multi_writers_test();
  pfVar10 = pfVar19;
LAB_0011805c:
  pfStack_2b18 = (fdb_encryption_key *)0x11806c;
  flush_before_commit_multi_writers_test();
LAB_0011806c:
  pfStack_2b18 = (fdb_encryption_key *)0x11807c;
  flush_before_commit_multi_writers_test();
LAB_0011807c:
  pfVar13 = &fStack_2a60;
  ppfVar12 = &fStack_2a60.bub_ctx.handle;
  pfVar21 = &fStack_2a60.config.encryption_key;
  pfStack_2b18 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_2e90 = (fdb_encryption_key *)0x1180a9;
  uStack_2b40 = uVar26;
  ppfStack_2b38 = ppfVar12;
  pfStack_2b30 = pfVar11;
  pfStack_2b28 = pfVar10;
  pfStack_2b20 = pfVar13;
  pfStack_2b18 = pfVar21;
  gettimeofday((timeval *)(auStack_2e68 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_2e90 = (fdb_encryption_key *)0x1180ae;
  memleak_start();
  pfStack_2e90 = (fdb_encryption_key *)0x1180ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar18 = &fStack_2c38;
  pfStack_2e90 = (fdb_encryption_key *)0x1180ca;
  fdb_get_default_config();
  pfStack_2e90 = (fdb_encryption_key *)0x1180d4;
  fdb_get_default_kvs_config();
  fStack_2c38.buffercache_size = 0;
  fStack_2c38.wal_threshold = 0x1000;
  fStack_2c38.flags = 1;
  fStack_2c38.durability_opt = '\x02';
  fStack_2c38.auto_commit = true;
  pfStack_2e90 = (fdb_encryption_key *)0x118107;
  fVar3 = fdb_open(&pfStack_2e78,"dummy1",pfVar18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_2e90 = (fdb_encryption_key *)0x118123;
    fVar3 = fdb_kvs_open_default(pfStack_2e78,&pfStack_2e80,(fdb_kvs_config *)(auStack_2e68 + 8));
    pcVar23 = (char *)pfVar13;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c1;
    pcVar23 = "body%d";
    pfVar21 = (fdb_encryption_key *)0x0;
    do {
      pfStack_2e90 = (fdb_encryption_key *)0x118154;
      sprintf((char *)afStack_2d38,"key%d",pfVar21);
      pfStack_2e90 = (fdb_encryption_key *)0x118163;
      sprintf((char *)apfStack_2e38,"body%d",pfVar21);
      pfVar11 = pfStack_2e80;
      pfStack_2e90 = (fdb_encryption_key *)0x118170;
      sVar14 = strlen((char *)afStack_2d38);
      pfVar18 = (fdb_config *)(sVar14 + 1);
      pfStack_2e90 = (fdb_encryption_key *)0x11817c;
      sVar14 = strlen((char *)apfStack_2e38);
      pfStack_2e90 = (fdb_encryption_key *)0x118191;
      fVar3 = fdb_set_kv(pfVar11,afStack_2d38,(size_t)pfVar18,apfStack_2e38,sVar14 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_2e90 = (fdb_encryption_key *)0x118398;
        auto_commit_test();
        goto LAB_00118398;
      }
      uVar24 = (int)pfVar21 + 1;
      pfVar21 = (fdb_encryption_key *)(ulong)uVar24;
    } while (uVar24 != 5000);
    pfVar10 = afStack_2d38;
    ppfVar12 = apfStack_2e38;
    pfVar11 = (fdb_kvs_handle *)auStack_2e68;
    pfVar21 = (fdb_encryption_key *)auStack_2e70;
    pfVar18 = (fdb_config *)0x0;
    do {
      pfStack_2e90 = (fdb_encryption_key *)0x1181cf;
      sprintf((char *)pfVar10,"key%d",pfVar18);
      pfStack_2e90 = (fdb_encryption_key *)0x1181e2;
      sprintf((char *)ppfVar12,"body%d",pfVar18);
      pfVar13 = pfStack_2e80;
      pfStack_2e90 = (fdb_encryption_key *)0x1181ef;
      sVar14 = strlen((char *)pfVar10);
      pfStack_2e90 = (fdb_encryption_key *)0x118204;
      fVar3 = fdb_get_kv(pfVar13,pfVar10,sVar14 + 1,(void **)pfVar11,(size_t *)pfVar21);
      pcVar23 = (char *)auStack_2e68._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183a5;
      pfStack_2e90 = (fdb_encryption_key *)0x118221;
      iVar4 = bcmp((void *)auStack_2e68._0_8_,ppfVar12,(size_t)auStack_2e70);
      if (iVar4 != 0) goto LAB_00118398;
      pfStack_2e90 = (fdb_encryption_key *)0x118231;
      fdb_free_block(pcVar23);
      uVar24 = (int)pfVar18 + 1;
      pfVar18 = (fdb_config *)(ulong)uVar24;
    } while (uVar24 != 5000);
    pfStack_2e90 = (fdb_encryption_key *)0x118245;
    fVar3 = fdb_kvs_close(pfStack_2e80);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c6;
    pfStack_2e90 = (fdb_encryption_key *)0x118257;
    fVar3 = fdb_close(pfStack_2e78);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183cb;
    pfStack_2e90 = (fdb_encryption_key *)0x118278;
    fVar3 = fdb_open(&pfStack_2e78,"dummy1",&fStack_2c38);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d0;
    pfStack_2e90 = (fdb_encryption_key *)0x118294;
    fVar3 = fdb_kvs_open_default(pfStack_2e78,&pfStack_2e80,(fdb_kvs_config *)(auStack_2e68 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d5;
    pfVar10 = afStack_2d38;
    ppfVar12 = apfStack_2e38;
    pfVar11 = (fdb_kvs_handle *)auStack_2e68;
    pfVar21 = (fdb_encryption_key *)auStack_2e70;
    pfVar18 = (fdb_config *)0x0;
    do {
      pfStack_2e90 = (fdb_encryption_key *)0x1182c8;
      sprintf((char *)pfVar10,"key%d",pfVar18);
      pfStack_2e90 = (fdb_encryption_key *)0x1182db;
      sprintf((char *)ppfVar12,"body%d",pfVar18);
      pfVar13 = pfStack_2e80;
      pfStack_2e90 = (fdb_encryption_key *)0x1182e8;
      sVar14 = strlen((char *)pfVar10);
      pfStack_2e90 = (fdb_encryption_key *)0x1182fd;
      fVar3 = fdb_get_kv(pfVar13,pfVar10,sVar14 + 1,(void **)pfVar11,(size_t *)pfVar21);
      pcVar23 = (char *)auStack_2e68._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183b7;
      pfStack_2e90 = (fdb_encryption_key *)0x11831a;
      iVar4 = bcmp((void *)auStack_2e68._0_8_,ppfVar12,(size_t)auStack_2e70);
      if (iVar4 != 0) goto LAB_001183aa;
      pfStack_2e90 = (fdb_encryption_key *)0x11832a;
      fdb_free_block(pcVar23);
      uVar24 = (int)pfVar18 + 1;
      pfVar18 = (fdb_config *)(ulong)uVar24;
    } while (uVar24 != 5000);
    pfStack_2e90 = (fdb_encryption_key *)0x11833e;
    fVar3 = fdb_close(pfStack_2e78);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_2e90 = (fdb_encryption_key *)0x11834b;
      fdb_shutdown();
      pfStack_2e90 = (fdb_encryption_key *)0x118350;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_2e90 = (fdb_encryption_key *)0x118381;
      fprintf(_stderr,pcVar23,"auto commit test");
      return;
    }
  }
  else {
LAB_001183bc:
    pfStack_2e90 = (fdb_encryption_key *)0x1183c1;
    auto_commit_test();
    pcVar23 = (char *)pfVar13;
LAB_001183c1:
    pfStack_2e90 = (fdb_encryption_key *)0x1183c6;
    auto_commit_test();
LAB_001183c6:
    pfStack_2e90 = (fdb_encryption_key *)0x1183cb;
    auto_commit_test();
LAB_001183cb:
    pfStack_2e90 = (fdb_encryption_key *)0x1183d0;
    auto_commit_test();
LAB_001183d0:
    pfStack_2e90 = (fdb_encryption_key *)0x1183d5;
    auto_commit_test();
LAB_001183d5:
    pfStack_2e90 = (fdb_encryption_key *)0x1183da;
    auto_commit_test();
  }
  pfStack_2e90 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_3108 = (code *)0x1183fc;
  pfStack_2eb8 = pfVar18;
  ppfStack_2eb0 = ppfVar12;
  pfStack_2ea8 = pfVar11;
  pfStack_2ea0 = pfVar10;
  pfStack_2e98 = (fdb_kvs_handle *)pcVar23;
  pfStack_2e90 = pfVar21;
  gettimeofday(&tStack_30b8,(__timezone_ptr_t)0x0);
  pcStack_3108 = (code *)0x118401;
  memleak_start();
  pcStack_3108 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_3108 = (code *)0x11841d;
  fdb_get_default_config();
  fStack_2fb0.buffercache_size = 0;
  fStack_2fb0.auto_commit = true;
  pcStack_3108 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_3108 = (code *)0x118446;
  memcpy(&fStack_2fb0,afStack_30a8,0xf8);
  pcStack_3108 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar26 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_30f0 + 8,"est1",5);
    builtin_strncpy(acStack_30f0,"./func_t",8);
    pcStack_3108 = (code *)0x11849b;
    fVar3 = fdb_open(&pfStack_3100,acStack_30f0,&fStack_2fb0);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_3108 = (code *)0x1184b7;
    fVar3 = fdb_kvs_open(pfStack_3100,&pfStack_30f8,"justonekv",&fStack_30d0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_3108 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_3108 = (code *)0x1184cd;
    fVar3 = fdb_get_file_info(pfStack_3100,afStack_30a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (afStack_30a8[0].file_size != fStack_2fb0.blocksize * 7) {
      pcStack_3108 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_3108 = (code *)0x1184f8;
    fVar3 = fdb_close(pfStack_3100);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar24 = (int)uVar26 + 1;
    uVar26 = (ulong)uVar24;
    if (uVar24 == 0) {
      pcStack_3108 = (code *)0x118523;
      fdb_shutdown();
      pcStack_3108 = (code *)0x118528;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pcStack_3108 = (code *)0x118559;
      fprintf(_stderr,pcVar23,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_3108 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_3108 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_3108 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_3110 = 0x745f636e75662f2e;
  pcStack_3120 = "justonekv";
  ppfStack_36a0 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_3130 = &pfStack_30f8;
  pcStack_3128 = acStack_30f0;
  uStack_3118 = uVar26;
  pcStack_3108 = (code *)&pfStack_3100;
  gettimeofday(&tStack_3540,(__timezone_ptr_t)0x0);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_3688 = (fdb_doc *)0x0;
  ppfStack_36a0 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_36a0 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_36a0 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_3530.buffercache_size = 0;
  fStack_3530.flags = 1;
  fStack_3530.purging_interval = 0;
  fStack_3530.compaction_threshold = '\0';
  ppfStack_36a0 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_3678 + 0x10),"dummy1",&fStack_3530);
  ppfStack_36a0 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_3678,"dummy1",&fStack_3530);
  ppfStack_36a0 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3678._16_8_,&pfStack_3680,&fStack_3650);
  ppfStack_36a0 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3678._0_8_,(fdb_kvs_handle **)(auStack_3678 + 8),
             &fStack_3650);
  ppfVar28 = apfStack_3638;
  uVar26 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_3438,"key%d",uVar26 & 0xffffffff);
    ppfStack_36a0 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_3238,"meta%d",uVar26 & 0xffffffff);
    ptr_fhandle = apfStack_3338;
    ppfStack_36a0 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar26 & 0xffffffff);
    ppfStack_36a0 = (fdb_kvs_handle **)0x1186a1;
    ppfVar12 = (fdb_kvs_handle **)strlen(acStack_3438);
    ppfStack_36a0 = (fdb_kvs_handle **)0x1186ac;
    sVar14 = strlen(acStack_3238);
    ppfStack_36a0 = (fdb_kvs_handle **)0x1186b7;
    sVar5 = strlen((char *)ptr_fhandle);
    ppfStack_36a0 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar28,acStack_3438,(size_t)ppfVar12,acStack_3238,sVar14,ptr_fhandle,sVar5);
    uVar26 = uVar26 + 1;
    ppfVar28 = ppfVar28 + 1;
  } while (uVar26 != 0x1e);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_3680,apfStack_3638[0]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_3680,apfStack_3638[1]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_3678._8_8_,apfStack_3638[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_3678._16_8_,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_3678._16_8_);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_3678._0_8_);
  ptr_handle = (fdb_kvs_handle **)0x1541a5;
  pfVar18 = &fStack_3530;
  ppfStack_36a0 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_3678 + 0x10),"dummy1",pfVar18);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_3678,"dummy1",pfVar18);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3678._16_8_,&pfStack_3680,&fStack_3650);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3678._0_8_,(fdb_kvs_handle **)(auStack_3678 + 8),
             &fStack_3650);
  uVar26 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_3688,apfStack_3638[uVar26]->key,apfStack_3638[uVar26]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_36a0 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(pfStack_3680,pfStack_3688);
    if (uVar26 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_36a0 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_3688);
    pfStack_3688 = (fdb_doc *)0x0;
    uVar26 = uVar26 + 1;
  } while (uVar26 != 4);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_3678._8_8_,apfStack_3638[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  lVar17 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_3680,apfStack_3638[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_36a0 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_3678._16_8_);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_3678._0_8_);
  ptr_handle = (fdb_kvs_handle **)0x1541a5;
  pfVar18 = &fStack_3530;
  ppfStack_36a0 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_3678 + 0x10),"dummy1",pfVar18);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_3678,"dummy1",pfVar18);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3678._16_8_,&pfStack_3680,&fStack_3650);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3678._0_8_,(fdb_kvs_handle **)(auStack_3678 + 8),
             &fStack_3650);
  uVar26 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_3688,apfStack_3638[uVar26]->key,apfStack_3638[uVar26]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_36a0 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(pfStack_3680,pfStack_3688);
    if ((uVar26 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_36a0 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_36a0 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_3688);
    pfStack_3688 = (fdb_doc *)0x0;
    uVar26 = uVar26 + 1;
  } while (uVar26 != 6);
  lVar17 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_3680,apfStack_3638[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_3678._8_8_,apfStack_3638[lVar17 + 6]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_36a0 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_3678._16_8_,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_3660,"dummy1",&fStack_3530);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_3660,&pfStack_3658,&fStack_3650);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_3660,'\x02');
  lVar17 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_3658,apfStack_3638[lVar17 + 8]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_36a0 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_3660,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_3678._16_8_);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_3678._0_8_);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_3660);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_3678 + 0x10),"dummy1",&fStack_3530);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3678._16_8_,&pfStack_3680,&fStack_3650);
  uVar26 = 0;
  do {
    ppfStack_36a0 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_3688,apfStack_3638[uVar26]->key,apfStack_3638[uVar26]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_36a0 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(pfStack_3680,pfStack_3688);
    if ((int)uVar26 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_36a0 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_3688);
    pfStack_3688 = (fdb_doc *)0x0;
    uVar26 = uVar26 + 1;
  } while (uVar26 != 10);
  pfVar18 = (fdb_config *)auStack_3678;
  ppfStack_36a0 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar18,"dummy1",&fStack_3530);
  ptr_fhandle = &pfStack_3660;
  ppfStack_36a0 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_3530);
  ptr_handle = (fdb_kvs_handle **)(auStack_3678 + 8);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3678._0_8_,ptr_handle,&fStack_3650);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_3660,&pfStack_3658,&fStack_3650);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x02');
  ppfVar12 = &pfStack_3680;
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_3680,apfStack_3638[10]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_3678._16_8_,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_3680,apfStack_3638[0xb]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_3678._8_8_,apfStack_3638[0xc]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_3678._16_8_,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_3678._8_8_,apfStack_3638[0xd]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_3660,'\x02');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_3658,apfStack_3638[0xe]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_3658,apfStack_3638[0xf]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_3680,apfStack_3638[0x10]);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_3660,'\x01');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_3680,apfStack_3638[0x11]);
  uVar26 = 0;
  ppfStack_36a0 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_3678._16_8_,'\0');
  ppfStack_36a0 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_3678._16_8_);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_3678._0_8_);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_3660);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_3678 + 0x10),"dummy1",&fStack_3530);
  ppfStack_36a0 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3678._16_8_,ppfVar12,&fStack_3650);
  while( true ) {
    ppfStack_36a0 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_3688,apfStack_3638[uVar26 + 10]->key,apfStack_3638[uVar26 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_36a0 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(pfStack_3680,pfStack_3688);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_36a0 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_3688);
    pfStack_3688 = (fdb_doc *)0x0;
    uVar26 = uVar26 + 1;
    if (uVar26 == 8) {
      ppfStack_36a0 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_3678,"dummy1",&fStack_3530);
      ppfStack_36a0 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_3678._0_8_,(fdb_kvs_handle **)(auStack_3678 + 8),
                 &fStack_3650);
      ppfStack_36a0 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x02');
      ppfStack_36a0 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_3678._8_8_,apfStack_3638[0x14]);
      ppfStack_36a0 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_3678._16_8_,"dummy2");
      ppfStack_36a0 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_3678._0_8_,'\x01');
      ppfStack_36a0 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_3678._16_8_);
      ppfStack_36a0 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_3678._0_8_);
      lVar17 = 0;
      do {
        ppfStack_36a0 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_3638[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x1e);
      ppfStack_36a0 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_36a0 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      ppfStack_36a0 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar23,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_36a0 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_36a0 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_36a0 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_36a0 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_36a0 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_198e8 = (fdb_doc *)0x118dba;
  ppfStack_36c8 = &pfStack_3688;
  pfStack_36c0 = pfVar18;
  ppfStack_36b8 = ptr_fhandle;
  uStack_36b0 = uVar26;
  ppfStack_36a8 = ptr_handle;
  ppfStack_36a0 = ppfVar12;
  gettimeofday(&tStack_19880,(__timezone_ptr_t)0x0);
  pfStack_198e8 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_198d0 = (fdb_doc *)0x0;
  pfStack_198e8 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_198e8 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_198e8 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_19608.flags = 1;
  fStack_19608.purging_interval = 0;
  fStack_19608.compaction_threshold = '\0';
  fStack_19608.durability_opt = '\x02';
  pfStack_198e8 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_198c8,"dummy1",&fStack_19608);
  pfStack_198e8 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_198c8,&pfStack_198b8,&fStack_19870);
  ppfVar28 = apfStack_19410;
  pfVar10 = afStack_19810;
  pfVar19 = (fdb_doc *)0x0;
  lVar17 = 0;
  do {
    sVar14 = 0xff7f;
    if (lVar17 == 1) {
      sVar14 = 0x1fff;
    }
    if (lVar17 == 0) {
      sVar14 = 0x7fff;
    }
    pfStack_198e8 = (fdb_doc *)0x118e7c;
    lStack_198b0 = lVar17;
    memset(asStack_13650,0x5f,sVar14);
    *(undefined1 *)((long)asStack_13650 + sVar14) = 0;
    lVar17 = 0;
    doc_00 = ppfVar28;
    lStack_198a8 = (long)pfVar19;
    ppfStack_198a0 = ppfVar28;
    sStack_19888 = sVar14;
    do {
      pfStack_198e8 = (fdb_doc *)0x118eb2;
      lStack_19898 = lVar17;
      sprintf((char *)pfVar10,"%08d");
      asStack_13650[0] = afStack_19810[0].keylen;
      uVar26 = 0;
      lStack_198c0 = (long)pfVar19;
      ppfStack_19890 = doc_00;
      do {
        pfStack_198e8 = (fdb_doc *)0x118eee;
        sprintf((char *)pfVar10,"%08d",uVar26 & 0xffffffff);
        *(size_t *)((long)apfStack_19410 + sStack_19888 + 0x5db8) = afStack_19810[0].keylen;
        uVar24 = (int)lStack_198c0 + (int)uVar26;
        pfStack_198e8 = (fdb_doc *)0x118f27;
        sprintf(acStack_19510,"meta%d",(ulong)uVar24);
        pfStack_198e8 = (fdb_doc *)0x118f3a;
        sprintf(acStack_19710,"body%d",(ulong)uVar24);
        pfStack_198e8 = (fdb_doc *)0x118f47;
        sVar14 = strlen((char *)asStack_13650);
        pfStack_198e8 = (fdb_doc *)0x118f53;
        sVar5 = strlen(acStack_19510);
        pfStack_198e8 = (fdb_doc *)0x118f67;
        sVar9 = strlen(acStack_19710);
        lVar1 = lStack_198c0;
        pcVar23 = acStack_19710;
        pfStack_198e8 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_00,asStack_13650,sVar14 + 1,acStack_19510,sVar5 + 1,pcVar23,sVar9 + 1);
        uVar26 = uVar26 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar26 != 10);
      lVar17 = lStack_19898 + 1;
      doc_00 = ppfStack_19890 + 10;
      pfVar19 = (fdb_doc *)(lVar1 + 10);
    } while (lVar17 != 100);
    lVar17 = lStack_198b0 + 1;
    ppfVar28 = ppfStack_198a0 + 1000;
    pfVar19 = (fdb_doc *)(lStack_198a8 + 1000);
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    pfStack_198e8 = (fdb_doc *)0x119010;
    fdb_set(pfStack_198b8,apfStack_19410[lVar17]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3000);
  pfStack_198e8 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_198c8,'\x01');
  pfStack_198e8 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_198c8,&fStack_19858);
  if (fStack_19858.doc_count != 3000) {
    pfStack_198e8 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar17 = 0;
  while( true ) {
    pfStack_198e8 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_198d0,apfStack_19410[lVar17]->key,apfStack_19410[lVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_198e8 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_198b8,pfStack_198d0);
    pfVar27 = pfStack_198d0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_198d0->key;
    pfVar10 = apfStack_19410[lVar17];
    pcVar23 = (char *)pfVar10->key;
    pfStack_198e8 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_00,pcVar23,pfStack_198d0->keylen);
    pfVar19 = pfVar27;
    if (iVar4 != 0) {
      pfStack_198e8 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)pfVar27->meta;
    pcVar23 = (char *)pfVar10->meta;
    pfStack_198e8 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_00,pcVar23,pfVar27->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_00 = (fdb_doc **)pfVar27->body;
    pcVar23 = (char *)pfVar10->body;
    pfStack_198e8 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_00,pcVar23,pfVar27->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_198e8 = (fdb_doc *)0x11910e;
    fdb_doc_free(pfVar27);
    pfStack_198d0 = (fdb_doc *)0x0;
    lVar17 = lVar17 + 1;
    if (lVar17 == 3000) {
      pfStack_198e8 = (fdb_doc *)0x119131;
      fdb_close(pfStack_198c8);
      lVar17 = 0;
      do {
        pfStack_198e8 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_19410[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3000);
      pfStack_198e8 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_198e8 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_198e8 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar23,"long key test");
      return;
    }
  }
  pfStack_198e8 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_198e8 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_198e8 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1dde0 = (fdb_kvs_handle *)0x1191df;
  ppfStack_19910 = &pfStack_198d0;
  pcStack_19908 = pcVar23;
  lStack_19900 = lVar17;
  pfStack_198f8 = pfVar19;
  ppfStack_198f0 = doc_00;
  pfStack_198e8 = pfVar10;
  gettimeofday((timeval *)(auStack_1dd58 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1dde0 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1dde0 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1dde0 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1dde0 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1dc10.wal_threshold = 0x400;
  fStack_1dc10.compaction_mode = '\0';
  fStack_1dc10.durability_opt = '\x02';
  pcVar25 = (char *)&fStack_1d918;
  doc = apfStack_1db18;
  pcVar23 = "kvs%d";
  uVar26 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1dde0 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    pcVar20 = (char *)(apfStack_1dd98 + (long)ptr_iterator);
    pfStack_1dde0 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,(char *)doc,&fStack_1dc10);
    pfVar11 = (fdb_kvs_handle *)pcVar25;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1ddc0 = ptr_iterator;
    pfStack_1ddb8 = (fdb_kvs_handle *)pcVar25;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1dde0 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar26));
      pfStack_1dde0 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)pcVar20,(fdb_kvs_handle **)pcVar25
                           ,(char *)doc,&fStack_1ddb0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1dde0 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      pcVar25 = (char *)&(((fdb_kvs_handle *)pcVar25)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1ddc0 + 1);
    uVar26 = uVar26 + 0x80;
    pcVar25 = (char *)&pfStack_1ddb8[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1dd18;
  doc = apfStack_1da18;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    uVar26 = 0;
    do {
      pfStack_1dde0 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar26);
      pfStack_1dde0 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc,"value%08d",uVar26);
      pcVar23 = *(char **)(&fStack_1d918.kvs_config.create_if_missing + (long)pfVar11 * 8);
      pfStack_1dde0 = (fdb_kvs_handle *)0x119323;
      sVar14 = strlen((char *)ptr_iterator);
      pcVar20 = (char *)(sVar14 + 1);
      pfStack_1dde0 = (fdb_kvs_handle *)0x11932f;
      sVar14 = strlen((char *)doc);
      pfStack_1dde0 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar23,ptr_iterator,(size_t)pcVar20,doc,sVar14 + 1);
      pcVar25 = (char *)pfVar11;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar24 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar24;
    } while (uVar24 != 10);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x400);
  pcVar20 = (char *)0x0;
  do {
    if (((ulong)pcVar20 & 1) == 0) {
      pfStack_1dde0 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1dd98[(long)pcVar20],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1dde0 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1dd98[(long)pcVar20],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while ((fdb_kvs_handle **)pcVar20 != (fdb_kvs_handle **)0x8);
  doc = (fdb_iterator **)0xffffffffffffff80;
  pcVar20 = (char *)apfStack_1b918;
  ptr_iterator = (fdb_iterator **)(auStack_1dd58 + 8);
  pfVar11 = (fdb_kvs_handle *)auStack_1dd58;
  do {
    pfStack_1dde0 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1d518[(long)doc],(fdb_kvs_info *)pfVar11);
    if ((fdb_custom_cmp_variable)auStack_1dd58._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1dde0 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1dde0 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1d518[(long)doc],(fdb_kvs_handle **)pcVar20,
                              10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc = doc + 0x10;
    pcVar20 = (char *)((long)pcVar20 + 0x400);
  } while (doc < (fdb_iterator **)0x380);
  pcVar20 = (char *)0x0;
  do {
    pfStack_1dde0 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1dd98[(long)pcVar20],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while ((fdb_kvs_handle **)pcVar20 != (fdb_kvs_handle **)0x8);
  pcVar20 = (char *)&pfStack_1ddc8;
  pfStack_1ddc8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1ddd0;
  pcVar25 = "key%08d";
  doc = apfStack_1dd18;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1dde0 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_1b918[(long)pfVar11],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar26 = 0;
    do {
      pfStack_1dde0 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1ddd0,(fdb_doc **)pcVar20);
      pcVar23 = (char *)pfVar11;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1dde0 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc,"key%08d",uVar26);
      pfStack_1dde0 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc,(char *)pfStack_1ddc8->op_stats);
      if (iVar4 != 0) {
        pfStack_1dde0 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar26 = (ulong)((int)uVar26 + 1);
      pfStack_1dde0 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1ddd0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1dde0 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1ddd0);
    pcVar23 = (char *)&(pfVar11->config).wal_threshold;
    bVar29 = pfVar11 < (fdb_kvs_handle *)0x380;
    pfVar11 = (fdb_kvs_handle *)pcVar23;
  } while (bVar29);
  pfStack_1dde0 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1ddc8);
  pcVar20 = "key%08d";
  ptr_iterator = apfStack_1dd18;
  doc = (fdb_iterator **)0x0;
  do {
    uVar26 = 0;
    do {
      pfStack_1dde0 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar26);
      pcVar25 = *(char **)(&fStack_1d918.kvs_config.create_if_missing + (long)doc * 8);
      pfStack_1dde0 = (fdb_kvs_handle *)0x119529;
      sVar14 = strlen((char *)ptr_iterator);
      pfStack_1dde0 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar25,ptr_iterator,sVar14 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar24 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar24;
    } while (uVar24 != 10);
    doc = (fdb_iterator **)((long)doc + 1);
  } while (doc != (fdb_iterator **)0x400);
  pcVar20 = "dummy_compact%d";
  ptr_iterator = apfStack_1db18;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1dde0 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar11 & 0xffffffff);
    pfStack_1dde0 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1dd98[(long)pfVar11],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x8);
  pcVar20 = (char *)&pfStack_1ddc8;
  pfStack_1ddc8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1ddd0;
  pcVar25 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1dde0 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1d918.kvs_config.create_if_missing + (long)pcVar25 * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar11 = (fdb_kvs_handle *)pcVar25;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1dde0 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1ddd0,(fdb_doc **)pcVar20);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1dde0 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1ddd0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1dde0 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1ddd0);
    pfVar11 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar25)->config).wal_threshold;
    bVar29 = pcVar25 < (fdb_kvs_handle *)0x380;
    pcVar25 = (char *)pfVar11;
  } while (bVar29);
  pfStack_1dde0 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1ddc8);
  pcVar20 = (char *)0x0;
  while( true ) {
    pfStack_1dde0 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1dd98[(long)pcVar20]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcVar20 = (char *)((long)pcVar20 + 1);
    if ((fdb_kvs_handle **)pcVar20 == (fdb_kvs_handle **)0x8) {
      pfStack_1dde0 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1dde0 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_1dde0 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar23,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1dde0 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1dde0 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1dde0 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1e158 = (code *)0x1196e0;
  ppfStack_1ddf8 = (fdb_kvs_handle **)pcVar20;
  ppfStack_1ddf0 = doc;
  ppfStack_1dde8 = ptr_iterator;
  pfStack_1dde0 = pfVar11;
  gettimeofday(&tStack_1e108,(__timezone_ptr_t)0x0);
  pcStack_1e158 = (code *)0x1196e5;
  memleak_start();
  pcStack_1e158 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar18 = &fStack_1e0f8;
  pcStack_1e158 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1e158 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1e158 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1e138,"./dummy1",pfVar18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1e158 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1e138,&pfStack_1e130,"db",&fStack_1e120);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1e158 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1e138,&pfStack_1e128,"db2",&fStack_1e120);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar18 = &fStack_1df00;
    pcStack_1e158 = (code *)0x119785;
    sprintf((char *)pfVar18,"key%d",0);
    ptr_iterator = apfStack_1e000;
    pcStack_1e158 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1e158 = (code *)0x1197a8;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar18);
    pcStack_1e158 = (code *)0x1197b3;
    sVar14 = strlen((char *)ptr_iterator);
    doc = &pfStack_1e140;
    pcStack_1e158 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc,pfVar18,(size_t)pfVar11,(void *)0x0,0,ptr_iterator,sVar14 + 1);
    pcStack_1e158 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1e130,(fdb_doc *)pfStack_1e140);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1e158 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1e138,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1e158 = (code *)0x11981b;
    sprintf((char *)pfStack_1e140->tree_cursor_prev,"bOdy%d",0);
    pcStack_1e158 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1e128,(fdb_doc *)pfStack_1e140);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1e158 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1e138,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1e158 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1e130,(fdb_doc *)pfStack_1e140);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1e158 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1e128,(fdb_doc *)pfStack_1e140);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1e158 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1e130,(fdb_doc *)pfStack_1e140);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1e158 = (code *)0x119899;
      fdb_close(pfStack_1e138);
      pcStack_1e158 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1e140);
      pcStack_1e158 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1e158 = (code *)0x1198ad;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pcStack_1e158 = (code *)0x1198de;
      fprintf(_stderr,pcVar23,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1e158 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1e158 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1e158 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1e158 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1e158 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1e158 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1e158 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1e158 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1e158 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1e158 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1e180 = pfVar18;
  ppfStack_1e178 = doc;
  pfStack_1e170 = (fdb_kvs_handle *)pcVar23;
  ppfStack_1e168 = ptr_iterator;
  pfStack_1e160 = pfVar11;
  pcStack_1e158 = (code *)uVar26;
  gettimeofday(&tStack_1e590,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1e580.wal_threshold = 0x400;
  fStack_1e580.flags = 1;
  fStack_1e580.purging_interval = 0;
  fStack_1e580.compaction_threshold = '\0';
  fStack_1e580.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1e580.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1e5e8,"./dummy1",&fStack_1e580);
  fdb_kvs_open_default(pfStack_1e5e8,&pfStack_1e5f0,&fStack_1e5a8);
  fVar3 = fdb_set_log_callback(pfStack_1e5f0,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1e5f0,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar26 = 0;
    do {
      sprintf(acStack_1e388,"key%d",uVar26);
      sprintf(acStack_1e288,"body%d",uVar26);
      pfVar11 = pfStack_1e5f0;
      sVar14 = strlen(acStack_1e388);
      sVar5 = strlen(acStack_1e288);
      fVar3 = fdb_set_kv(pfVar11,acStack_1e388,sVar14,acStack_1e288,sVar5);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar24 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar24;
    } while (uVar24 != 10);
    asStack_1e5d8[1] = 0x726162ffffffff;
    asStack_1e5d8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1e5c0 = 0xbdbdbdbd;
    uStack_1e5bc = 0xbdbdbdbd;
    uStack_1e5b8 = 0xbdbdbdbd;
    uStack_1e5b4 = 0xbdbdbdbd;
    uStack_1e5b0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1e5e8,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1e5f0);
    fdb_close(pfStack_1e5e8);
    fStack_1e580.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1e580.encryption_key.bytes,"bar",4);
    fStack_1e580.encryption_key.bytes[4] = 0xbd;
    fStack_1e580.encryption_key.bytes[5] = 0xbd;
    fStack_1e580.encryption_key.bytes[6] = 0xbd;
    fStack_1e580.encryption_key.bytes[7] = 0xbd;
    fStack_1e580.encryption_key.bytes[8] = 0xbd;
    fStack_1e580.encryption_key.bytes[9] = 0xbd;
    fStack_1e580.encryption_key.bytes[10] = 0xbd;
    fStack_1e580.encryption_key.bytes[0xb] = 0xbd;
    fStack_1e580.encryption_key.bytes[0xc] = 0xbd;
    fStack_1e580.encryption_key.bytes[0xd] = 0xbd;
    fStack_1e580.encryption_key.bytes[0xe] = 0xbd;
    fStack_1e580.encryption_key.bytes[0xf] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x10] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x11] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x12] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x13] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x14] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x15] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x16] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x17] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x18] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x19] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1e580.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1e5e8,"./dummy1",&fStack_1e580);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1e5e8,&pfStack_1e5f0,&fStack_1e5a8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1e5f0,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar26 = 0;
      while( true ) {
        sprintf(acStack_1e388,"key%d",uVar26);
        pfVar11 = pfStack_1e5f0;
        sVar14 = strlen(acStack_1e388);
        fVar3 = fdb_get_kv(pfVar11,acStack_1e388,sVar14,&pvStack_1e5e0,asStack_1e5d8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1e488,"body%d",uVar26);
        ptr = pvStack_1e5e0;
        iVar4 = bcmp(pvStack_1e5e0,acStack_1e488,asStack_1e5d8[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar24 = (int)uVar26 + 1;
        uVar26 = (ulong)uVar24;
        if (uVar24 == 10) {
          fdb_kvs_close(pfStack_1e5f0);
          fdb_close(pfStack_1e5e8);
          fdb_shutdown();
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar23,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
}

Assistant:

void custom_compare_commit_compact(bool eqkeys)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int count;
    int n = 10;
    static const int len = 1024;
    char keybuf[len];
    static const char *achar = "a";
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *iterator;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;


    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


    for (i=0;i<n;++i){
        if(eqkeys){
            sprintf(keybuf, "%d", i);
            for (j=1;j<len;++j) {
                keybuf[j] = *achar;
            }
        } else {
            sprintf(keybuf, "000%d", i);
            for (j=4;j<len;++j) {
                keybuf[j] = *achar;
            }
        }
        keybuf[len-1] = '\0';
        // set kv
        status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact pre & post commit
    fdb_compact(dbfile, NULL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_compact(dbfile, NULL);

    // scan after flush
    count = 0;
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    if (eqkeys) {
        // since the custom cmp function compares only 3rd~8th bytes,
        // all keys are identified as the same key.
        TEST_CHK(count == 1);
    } else {
        TEST_CHK(count == n);
    }

    fdb_iterator_close(iterator);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("custom compare commit compact");

}